

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long lVar73;
  undefined1 auVar74 [32];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  undefined1 auVar93 [28];
  byte bVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  ulong uVar98;
  Geometry *geometry;
  long lVar99;
  Primitive *pPVar100;
  ulong uVar101;
  bool bVar102;
  undefined4 uVar103;
  undefined8 uVar104;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar105 [16];
  float fVar120;
  float fVar122;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar109 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar126;
  undefined8 uVar127;
  vint4 bi_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  undefined1 auVar139 [64];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  vint4 ai;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 bi;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar168 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [64];
  vint4 ai_1;
  undefined1 auVar184 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar195;
  float fVar196;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar197;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [64];
  undefined1 auVar201 [16];
  undefined4 uVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7bc;
  RayQueryContext *local_7b8;
  Ray *local_7b0;
  undefined4 local_7a4;
  undefined1 local_7a0 [8];
  undefined1 auStack_798 [8];
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  Primitive *local_738;
  Precalculations *local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  int local_2c0;
  int local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined1 local_260 [32];
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar185 [16];
  
  local_730 = pre;
  PVar9 = prim[1];
  uVar101 = (ulong)(byte)PVar9;
  lVar73 = uVar101 * 0x19;
  fVar141 = *(float *)(prim + lVar73 + 0x12);
  auVar19 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar73 + 6));
  auVar165._0_4_ = fVar141 * (ray->dir).field_0.m128[0];
  auVar165._4_4_ = fVar141 * (ray->dir).field_0.m128[1];
  auVar165._8_4_ = fVar141 * (ray->dir).field_0.m128[2];
  auVar165._12_4_ = fVar141 * (ray->dir).field_0.m128[3];
  auVar105._0_4_ = fVar141 * auVar19._0_4_;
  auVar105._4_4_ = fVar141 * auVar19._4_4_;
  auVar105._8_4_ = fVar141 * auVar19._8_4_;
  auVar105._12_4_ = fVar141 * auVar19._12_4_;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 4 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar101 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar98 = (ulong)(uint)((int)(uVar101 * 9) * 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + uVar101 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar98 = (ulong)(uint)((int)(uVar101 * 5) << 2);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar213._4_4_ = auVar165._0_4_;
  auVar213._0_4_ = auVar165._0_4_;
  auVar213._8_4_ = auVar165._0_4_;
  auVar213._12_4_ = auVar165._0_4_;
  auVar129 = vshufps_avx(auVar165,auVar165,0x55);
  auVar106 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar141 = auVar106._0_4_;
  auVar203._0_4_ = fVar141 * auVar15._0_4_;
  fVar120 = auVar106._4_4_;
  auVar203._4_4_ = fVar120 * auVar15._4_4_;
  fVar121 = auVar106._8_4_;
  auVar203._8_4_ = fVar121 * auVar15._8_4_;
  fVar122 = auVar106._12_4_;
  auVar203._12_4_ = fVar122 * auVar15._12_4_;
  auVar201._0_4_ = auVar18._0_4_ * fVar141;
  auVar201._4_4_ = auVar18._4_4_ * fVar120;
  auVar201._8_4_ = auVar18._8_4_ * fVar121;
  auVar201._12_4_ = auVar18._12_4_ * fVar122;
  auVar184._0_4_ = auVar142._0_4_ * fVar141;
  auVar184._4_4_ = auVar142._4_4_ * fVar120;
  auVar184._8_4_ = auVar142._8_4_ * fVar121;
  auVar184._12_4_ = auVar142._12_4_ * fVar122;
  auVar106 = vfmadd231ps_fma(auVar203,auVar129,auVar14);
  auVar130 = vfmadd231ps_fma(auVar201,auVar129,auVar17);
  auVar129 = vfmadd231ps_fma(auVar184,auVar107,auVar129);
  auVar153 = vfmadd231ps_fma(auVar106,auVar213,auVar19);
  auVar130 = vfmadd231ps_fma(auVar130,auVar213,auVar16);
  auVar160 = vfmadd231ps_fma(auVar129,auVar108,auVar213);
  auVar214._4_4_ = auVar105._0_4_;
  auVar214._0_4_ = auVar105._0_4_;
  auVar214._8_4_ = auVar105._0_4_;
  auVar214._12_4_ = auVar105._0_4_;
  auVar129 = vshufps_avx(auVar105,auVar105,0x55);
  auVar106 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar141 = auVar106._0_4_;
  auVar166._0_4_ = fVar141 * auVar15._0_4_;
  fVar120 = auVar106._4_4_;
  auVar166._4_4_ = fVar120 * auVar15._4_4_;
  fVar121 = auVar106._8_4_;
  auVar166._8_4_ = fVar121 * auVar15._8_4_;
  fVar122 = auVar106._12_4_;
  auVar166._12_4_ = fVar122 * auVar15._12_4_;
  auVar128._0_4_ = auVar18._0_4_ * fVar141;
  auVar128._4_4_ = auVar18._4_4_ * fVar120;
  auVar128._8_4_ = auVar18._8_4_ * fVar121;
  auVar128._12_4_ = auVar18._12_4_ * fVar122;
  auVar106._0_4_ = auVar142._0_4_ * fVar141;
  auVar106._4_4_ = auVar142._4_4_ * fVar120;
  auVar106._8_4_ = auVar142._8_4_ * fVar121;
  auVar106._12_4_ = auVar142._12_4_ * fVar122;
  auVar14 = vfmadd231ps_fma(auVar166,auVar129,auVar14);
  auVar15 = vfmadd231ps_fma(auVar128,auVar129,auVar17);
  auVar17 = vfmadd231ps_fma(auVar106,auVar129,auVar107);
  auVar18 = vfmadd231ps_fma(auVar14,auVar214,auVar19);
  auVar107 = vfmadd231ps_fma(auVar15,auVar214,auVar16);
  auVar142 = vfmadd231ps_fma(auVar17,auVar214,auVar108);
  local_330._8_4_ = 0x7fffffff;
  local_330._0_8_ = 0x7fffffff7fffffff;
  local_330._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx(auVar153,local_330);
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  auVar19 = vcmpps_avx(auVar19,auVar159,1);
  auVar14 = vblendvps_avx(auVar153,auVar159,auVar19);
  auVar19 = vandps_avx(auVar130,local_330);
  auVar19 = vcmpps_avx(auVar19,auVar159,1);
  auVar15 = vblendvps_avx(auVar130,auVar159,auVar19);
  auVar19 = vandps_avx(auVar160,local_330);
  auVar19 = vcmpps_avx(auVar19,auVar159,1);
  auVar19 = vblendvps_avx(auVar160,auVar159,auVar19);
  auVar16 = vrcpps_avx(auVar14);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = &DAT_3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar16,auVar180);
  auVar16 = vfmadd132ps_fma(auVar14,auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar14,auVar180);
  auVar17 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar19);
  auVar15 = vfnmadd213ps_fma(auVar19,auVar14,auVar180);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar101 * 7 + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar108 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar160._0_4_ = auVar16._0_4_ * auVar19._0_4_;
  auVar160._4_4_ = auVar16._4_4_ * auVar19._4_4_;
  auVar160._8_4_ = auVar16._8_4_ * auVar19._8_4_;
  auVar160._12_4_ = auVar16._12_4_ * auVar19._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar101 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar14);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar167._0_4_ = auVar16._0_4_ * auVar19._0_4_;
  auVar167._4_4_ = auVar16._4_4_ * auVar19._4_4_;
  auVar167._8_4_ = auVar16._8_4_ * auVar19._8_4_;
  auVar167._12_4_ = auVar16._12_4_ * auVar19._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar101 * -2 + 6);
  auVar19 = vpmovsxwd_avx(auVar16);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar107);
  auVar185._0_4_ = auVar19._0_4_ * auVar17._0_4_;
  auVar185._4_4_ = auVar19._4_4_ * auVar17._4_4_;
  auVar185._8_4_ = auVar19._8_4_ * auVar17._8_4_;
  auVar185._12_4_ = auVar19._12_4_ * auVar17._12_4_;
  auVar187 = ZEXT1664(auVar185);
  auVar19 = vcvtdq2ps_avx(auVar14);
  auVar19 = vsubps_avx(auVar19,auVar107);
  auVar129._0_4_ = auVar17._0_4_ * auVar19._0_4_;
  auVar129._4_4_ = auVar17._4_4_ * auVar19._4_4_;
  auVar129._8_4_ = auVar17._8_4_ * auVar19._8_4_;
  auVar129._12_4_ = auVar17._12_4_ * auVar19._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar98 + uVar101 + 6);
  auVar19 = vpmovsxwd_avx(auVar17);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar142);
  auVar153._0_4_ = auVar108._0_4_ * auVar19._0_4_;
  auVar153._4_4_ = auVar108._4_4_ * auVar19._4_4_;
  auVar153._8_4_ = auVar108._8_4_ * auVar19._8_4_;
  auVar153._12_4_ = auVar108._12_4_ * auVar19._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar101 * 0x17 + 6);
  auVar19 = vpmovsxwd_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar142);
  auVar107._0_4_ = auVar108._0_4_ * auVar19._0_4_;
  auVar107._4_4_ = auVar108._4_4_ * auVar19._4_4_;
  auVar107._8_4_ = auVar108._8_4_ * auVar19._8_4_;
  auVar107._12_4_ = auVar108._12_4_ * auVar19._12_4_;
  auVar19 = vpminsd_avx(auVar160,auVar167);
  auVar14 = vpminsd_avx(auVar185,auVar129);
  auVar19 = vmaxps_avx(auVar19,auVar14);
  auVar14 = vpminsd_avx(auVar153,auVar107);
  uVar103 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar189._4_4_ = uVar103;
  auVar189._0_4_ = uVar103;
  auVar189._8_4_ = uVar103;
  auVar189._12_4_ = uVar103;
  auVar14 = vmaxps_avx(auVar14,auVar189);
  auVar19 = vmaxps_avx(auVar19,auVar14);
  local_340._0_4_ = auVar19._0_4_ * 0.99999964;
  local_340._4_4_ = auVar19._4_4_ * 0.99999964;
  local_340._8_4_ = auVar19._8_4_ * 0.99999964;
  local_340._12_4_ = auVar19._12_4_ * 0.99999964;
  auVar19 = vpmaxsd_avx(auVar160,auVar167);
  auVar14 = vpmaxsd_avx(auVar185,auVar129);
  auVar19 = vminps_avx(auVar19,auVar14);
  auVar14 = vpmaxsd_avx(auVar153,auVar107);
  fVar141 = ray->tfar;
  auVar142._4_4_ = fVar141;
  auVar142._0_4_ = fVar141;
  auVar142._8_4_ = fVar141;
  auVar142._12_4_ = fVar141;
  auVar14 = vminps_avx(auVar14,auVar142);
  auVar19 = vminps_avx(auVar19,auVar14);
  auVar108._0_4_ = auVar19._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar19._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar19._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar19._12_4_ * 1.0000004;
  auVar130[4] = PVar9;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar9;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar9;
  auVar130._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar130,_DAT_01ff0cf0);
  auVar19 = vcmpps_avx(local_340,auVar108,2);
  auVar19 = vandps_avx(auVar19,auVar14);
  uVar96 = vmovmskps_avx(auVar19);
  bVar102 = uVar96 != 0;
  if (bVar102) {
    uVar96 = uVar96 & 0xff;
    local_480 = mm_lookupmask_ps._16_8_;
    uStack_478 = mm_lookupmask_ps._24_8_;
    uStack_470 = mm_lookupmask_ps._16_8_;
    uStack_468 = mm_lookupmask_ps._24_8_;
    pPVar100 = prim;
    do {
      auVar164 = local_440;
      local_2e0 = auVar187._0_32_;
      lVar22 = 0;
      uVar101 = (ulong)uVar96;
      for (uVar98 = uVar101; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar101 = uVar101 - 1 & uVar101;
      local_7a4 = *(undefined4 *)(pPVar100 + lVar22 * 4 + 6);
      uVar98 = (ulong)(uint)((int)lVar22 << 6);
      local_728 = (ulong)*(uint *)(pPVar100 + 2);
      pGVar11 = (context->scene->geometries).items[*(uint *)(pPVar100 + 2)].ptr;
      pPVar1 = prim + uVar98 + lVar73 + 0x16;
      local_6a0 = *(undefined8 *)pPVar1;
      uStack_698 = *(undefined8 *)(pPVar1 + 8);
      if (uVar101 != 0) {
        uVar97 = uVar101 - 1 & uVar101;
        for (uVar95 = uVar101; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_490 = *(undefined1 (*) [16])(prim + uVar98 + lVar73 + 0x26);
      auVar106 = local_490;
      local_4a0 = *(undefined1 (*) [16])(prim + uVar98 + lVar73 + 0x36);
      local_4b0 = *(undefined1 (*) [16])(prim + uVar98 + lVar73 + 0x46);
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar5 = (ray->org).field_0;
      auVar14 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar5);
      uVar103 = auVar14._0_4_;
      auVar161._4_4_ = uVar103;
      auVar161._0_4_ = uVar103;
      auVar161._8_4_ = uVar103;
      auVar161._12_4_ = uVar103;
      auVar19 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      aVar6 = (pre->ray_space).vx.field_0;
      aVar7 = (pre->ray_space).vy.field_0;
      fVar141 = (pre->ray_space).vz.field_0.m128[0];
      fVar120 = (pre->ray_space).vz.field_0.m128[1];
      fVar121 = (pre->ray_space).vz.field_0.m128[2];
      fVar122 = (pre->ray_space).vz.field_0.m128[3];
      auVar175._0_4_ = auVar14._0_4_ * fVar141;
      auVar175._4_4_ = auVar14._4_4_ * fVar120;
      auVar175._8_4_ = auVar14._8_4_ * fVar121;
      auVar175._12_4_ = auVar14._12_4_ * fVar122;
      auVar19 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar7,auVar19);
      auVar18 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar161);
      auVar19 = vblendps_avx(auVar18,*(undefined1 (*) [16])pPVar1,8);
      auVar15 = vsubps_avx(local_490,(undefined1  [16])aVar5);
      uVar103 = auVar15._0_4_;
      auVar176._4_4_ = uVar103;
      auVar176._0_4_ = uVar103;
      auVar176._8_4_ = uVar103;
      auVar176._12_4_ = uVar103;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar190._0_4_ = auVar15._0_4_ * fVar141;
      auVar190._4_4_ = auVar15._4_4_ * fVar120;
      auVar190._8_4_ = auVar15._8_4_ * fVar121;
      auVar190._12_4_ = auVar15._12_4_ * fVar122;
      auVar14 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar7,auVar14);
      auVar108 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar6,auVar176);
      auVar14 = vblendps_avx(auVar108,local_490,8);
      auVar129 = local_4a0;
      auVar16 = vsubps_avx(local_4a0,(undefined1  [16])aVar5);
      uVar103 = auVar16._0_4_;
      auVar181._4_4_ = uVar103;
      auVar181._0_4_ = uVar103;
      auVar181._8_4_ = uVar103;
      auVar181._12_4_ = uVar103;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar204._0_4_ = auVar16._0_4_ * fVar141;
      auVar204._4_4_ = auVar16._4_4_ * fVar120;
      auVar204._8_4_ = auVar16._8_4_ * fVar121;
      auVar204._12_4_ = auVar16._12_4_ * fVar122;
      auVar15 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar7,auVar15);
      auVar107 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar181);
      auVar15 = vblendps_avx(auVar107,local_4a0,8);
      auVar17 = vsubps_avx(local_4b0,(undefined1  [16])aVar5);
      uVar103 = auVar17._0_4_;
      auVar182._4_4_ = uVar103;
      auVar182._0_4_ = uVar103;
      auVar182._8_4_ = uVar103;
      auVar182._12_4_ = uVar103;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar207._0_4_ = auVar17._0_4_ * fVar141;
      auVar207._4_4_ = auVar17._4_4_ * fVar120;
      auVar207._8_4_ = auVar17._8_4_ * fVar121;
      auVar207._12_4_ = auVar17._12_4_ * fVar122;
      auVar16 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar16);
      auVar142 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar182);
      auVar16 = vblendps_avx(auVar142,local_4b0,8);
      auVar19 = vandps_avx(auVar19,local_330);
      auVar14 = vandps_avx(auVar14,local_330);
      auVar17 = vmaxps_avx(auVar19,auVar14);
      auVar19 = vandps_avx(auVar15,local_330);
      auVar14 = vandps_avx(auVar16,local_330);
      auVar19 = vmaxps_avx(auVar19,auVar14);
      auVar19 = vmaxps_avx(auVar17,auVar19);
      auVar14 = vmovshdup_avx(auVar19);
      auVar14 = vmaxss_avx(auVar14,auVar19);
      auVar19 = vshufpd_avx(auVar19,auVar19,1);
      auVar19 = vmaxss_avx(auVar19,auVar14);
      uVar98 = (long)iVar10 * 0x40;
      lVar22 = (long)iVar10 * 0x44;
      auVar14 = vmovshdup_avx(auVar18);
      uVar104 = auVar14._0_8_;
      local_400._8_8_ = uVar104;
      local_400._0_8_ = uVar104;
      local_400._16_8_ = uVar104;
      local_400._24_8_ = uVar104;
      auVar14 = vmovshdup_avx(auVar108);
      uVar104 = auVar14._0_8_;
      local_620._8_8_ = uVar104;
      local_620._0_8_ = uVar104;
      local_620._16_8_ = uVar104;
      local_620._24_8_ = uVar104;
      auVar8 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      uVar202 = auVar107._0_4_;
      local_600._4_4_ = uVar202;
      local_600._0_4_ = uVar202;
      local_600._8_4_ = uVar202;
      local_600._12_4_ = uVar202;
      local_600._16_4_ = uVar202;
      local_600._20_4_ = uVar202;
      local_600._24_4_ = uVar202;
      local_600._28_4_ = uVar202;
      auVar14 = vmovshdup_avx(auVar107);
      uVar104 = auVar14._0_8_;
      local_640._8_8_ = uVar104;
      local_640._0_8_ = uVar104;
      local_640._16_8_ = uVar104;
      local_640._24_8_ = uVar104;
      fVar141 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar92 = *(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      local_560 = auVar142._0_4_;
      auVar14 = vmovshdup_avx(auVar142);
      uVar104 = auVar14._0_8_;
      auVar117._4_4_ = local_560 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar117._0_4_ = local_560 * fVar141;
      auVar117._8_4_ = local_560 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar117._12_4_ = local_560 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar117._16_4_ = local_560 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar117._20_4_ = local_560 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar117._24_4_ = local_560 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar117._28_4_ = *(undefined4 *)(bezier_basis0 + lVar22 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar117,auVar8,local_600);
      local_540 = auVar14._0_4_;
      auVar119._0_4_ = local_540 * fVar141;
      fStack_53c = auVar14._4_4_;
      auVar119._4_4_ = fStack_53c * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar119._8_4_ = local_540 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar119._12_4_ = fStack_53c * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar119._16_4_ = local_540 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar119._20_4_ = fStack_53c * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar119._24_4_ = local_540 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar119._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar119,auVar8,local_640);
      local_720 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar103 = auVar108._0_4_;
      local_6c0._4_4_ = uVar103;
      local_6c0._0_4_ = uVar103;
      local_6c0._8_4_ = uVar103;
      local_6c0._12_4_ = uVar103;
      local_6c0._16_4_ = uVar103;
      local_6c0._20_4_ = uVar103;
      local_6c0._24_4_ = uVar103;
      local_6c0._28_4_ = uVar103;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_720,local_6c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_720,local_620);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      local_460._0_4_ = auVar18._0_4_;
      local_700._4_4_ = local_460._0_4_;
      local_700._0_4_ = local_460._0_4_;
      local_700._8_4_ = local_460._0_4_;
      local_700._12_4_ = local_460._0_4_;
      local_700._16_4_ = local_460._0_4_;
      local_700._20_4_ = local_460._0_4_;
      local_700._24_4_ = local_460._0_4_;
      local_700._28_4_ = local_460._0_4_;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar117,local_700);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar117,local_400);
      auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      fVar75 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fVar76 = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fVar77 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fVar78 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fVar79 = *(float *)(bezier_basis1 + lVar22 + 0xd9c);
      fVar80 = *(float *)(bezier_basis1 + lVar22 + 0xda0);
      fVar81 = *(float *)(bezier_basis1 + lVar22 + 0xda4);
      fStack_55c = local_560;
      fStack_558 = local_560;
      fStack_554 = local_560;
      fStack_550 = local_560;
      fStack_54c = local_560;
      fStack_548 = local_560;
      fStack_544 = local_560;
      auVar174._4_4_ = fVar76 * local_560;
      auVar174._0_4_ = fVar75 * local_560;
      auVar174._8_4_ = fVar77 * local_560;
      auVar174._12_4_ = fVar78 * local_560;
      auVar174._16_4_ = fVar79 * local_560;
      auVar174._20_4_ = fVar80 * local_560;
      auVar174._24_4_ = fVar81 * local_560;
      auVar174._28_4_ = *(undefined4 *)(bezier_basis0 + lVar22 + 0xda8);
      auVar16 = vfmadd231ps_fma(auVar174,auVar119,local_600);
      auVar150._4_4_ = fVar76 * fStack_53c;
      auVar150._0_4_ = fVar75 * local_540;
      auVar150._8_4_ = fVar77 * local_540;
      auVar150._12_4_ = fVar78 * fStack_53c;
      auVar150._16_4_ = fVar79 * local_540;
      auVar150._20_4_ = fVar80 * fStack_53c;
      auVar150._24_4_ = fVar81 * local_540;
      auVar150._28_4_ = uVar202;
      auVar17 = vfmadd231ps_fma(auVar150,auVar119,local_640);
      auVar174 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar174,local_6c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar174,local_620);
      auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar150,local_700);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar150,local_400);
      auVar110 = ZEXT1632(auVar16);
      auVar131 = ZEXT1632(auVar15);
      auVar118 = vsubps_avx(auVar110,auVar131);
      auVar147 = ZEXT1632(auVar17);
      _local_420 = ZEXT1632(auVar14);
      local_360 = vsubps_avx(auVar147,_local_420);
      auVar111._0_4_ = auVar14._0_4_ * auVar118._0_4_;
      auVar111._4_4_ = auVar14._4_4_ * auVar118._4_4_;
      auVar111._8_4_ = auVar14._8_4_ * auVar118._8_4_;
      auVar111._12_4_ = auVar14._12_4_ * auVar118._12_4_;
      auVar111._16_4_ = auVar118._16_4_ * 0.0;
      auVar111._20_4_ = auVar118._20_4_ * 0.0;
      auVar111._24_4_ = auVar118._24_4_ * 0.0;
      auVar111._28_4_ = 0;
      fVar141 = local_360._0_4_;
      auVar132._0_4_ = auVar15._0_4_ * fVar141;
      fVar120 = local_360._4_4_;
      auVar132._4_4_ = auVar15._4_4_ * fVar120;
      fVar121 = local_360._8_4_;
      auVar132._8_4_ = auVar15._8_4_ * fVar121;
      fVar122 = local_360._12_4_;
      auVar132._12_4_ = auVar15._12_4_ * fVar122;
      fVar123 = local_360._16_4_;
      auVar132._16_4_ = fVar123 * 0.0;
      fVar124 = local_360._20_4_;
      auVar132._20_4_ = fVar124 * 0.0;
      fVar125 = local_360._24_4_;
      auVar132._24_4_ = fVar125 * 0.0;
      auVar132._28_4_ = 0;
      auVar111 = vsubps_avx(auVar111,auVar132);
      auVar14 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar127 = auVar14._0_8_;
      local_80._8_8_ = uVar127;
      local_80._0_8_ = uVar127;
      local_80._16_8_ = uVar127;
      local_80._24_8_ = uVar127;
      auVar15 = vpermilps_avx(local_490,0xff);
      uVar127 = auVar15._0_8_;
      local_a0._8_8_ = uVar127;
      local_a0._0_8_ = uVar127;
      local_a0._16_8_ = uVar127;
      local_a0._24_8_ = uVar127;
      auVar15 = vpermilps_avx(local_4a0,0xff);
      uVar127 = auVar15._0_8_;
      local_c0._8_8_ = uVar127;
      local_c0._0_8_ = uVar127;
      local_c0._16_8_ = uVar127;
      local_c0._24_8_ = uVar127;
      auVar15 = vpermilps_avx(local_4b0,0xff);
      local_e0 = auVar15._0_8_;
      local_7a0._0_4_ = auVar92._0_4_;
      local_7a0._4_4_ = auVar92._4_4_;
      auStack_798._0_4_ = auVar92._8_4_;
      auStack_798._4_4_ = auVar92._12_4_;
      fStack_790 = auVar92._16_4_;
      fStack_78c = auVar92._20_4_;
      fStack_788 = auVar92._24_4_;
      fVar126 = auVar15._0_4_;
      fVar140 = auVar15._4_4_;
      auVar13._4_4_ = fVar140 * (float)local_7a0._4_4_;
      auVar13._0_4_ = fVar126 * (float)local_7a0._0_4_;
      auVar13._8_4_ = fVar126 * (float)auStack_798._0_4_;
      auVar13._12_4_ = fVar140 * (float)auStack_798._4_4_;
      auVar13._16_4_ = fVar126 * fStack_790;
      auVar13._20_4_ = fVar140 * fStack_78c;
      auVar13._24_4_ = fVar126 * fStack_788;
      auVar13._28_4_ = local_460._0_4_;
      auVar15 = vfmadd231ps_fma(auVar13,local_c0,auVar8);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_720,local_a0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar117,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar20._4_4_ = fVar76 * fVar140;
      auVar20._0_4_ = fVar75 * fVar126;
      auVar20._8_4_ = fVar77 * fVar126;
      auVar20._12_4_ = fVar78 * fVar140;
      auVar20._16_4_ = fVar79 * fVar126;
      auVar20._20_4_ = fVar80 * fVar140;
      auVar20._24_4_ = fVar81 * fVar126;
      auVar20._28_4_ = auVar117._28_4_;
      auVar16 = vfmadd231ps_fma(auVar20,auVar119,local_c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar174,local_a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar150,local_80);
      auVar21._4_4_ = fVar120 * fVar120;
      auVar21._0_4_ = fVar141 * fVar141;
      auVar21._8_4_ = fVar121 * fVar121;
      auVar21._12_4_ = fVar122 * fVar122;
      auVar21._16_4_ = fVar123 * fVar123;
      auVar21._20_4_ = fVar124 * fVar124;
      auVar21._24_4_ = fVar125 * fVar125;
      auVar21._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar21,auVar118,auVar118);
      auVar13 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar137._4_4_ = auVar13._4_4_ * auVar13._4_4_ * auVar14._4_4_;
      auVar137._0_4_ = auVar13._0_4_ * auVar13._0_4_ * auVar14._0_4_;
      auVar137._8_4_ = auVar13._8_4_ * auVar13._8_4_ * auVar14._8_4_;
      auVar137._12_4_ = auVar13._12_4_ * auVar13._12_4_ * auVar14._12_4_;
      auVar137._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
      auVar137._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
      auVar137._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
      auVar137._28_4_ = auVar13._28_4_;
      auVar177._4_4_ = auVar111._4_4_ * auVar111._4_4_;
      auVar177._0_4_ = auVar111._0_4_ * auVar111._0_4_;
      auVar177._8_4_ = auVar111._8_4_ * auVar111._8_4_;
      auVar177._12_4_ = auVar111._12_4_ * auVar111._12_4_;
      auVar177._16_4_ = auVar111._16_4_ * auVar111._16_4_;
      auVar177._20_4_ = auVar111._20_4_ * auVar111._20_4_;
      auVar177._24_4_ = auVar111._24_4_ * auVar111._24_4_;
      auVar177._28_4_ = auVar111._28_4_;
      auVar13 = vcmpps_avx(auVar177,auVar137,2);
      auVar152 = ZEXT3264(auVar13);
      fVar141 = auVar19._0_4_ * 4.7683716e-07;
      auVar211 = ZEXT464((uint)fVar141);
      auVar112._0_4_ = (float)iVar10;
      local_440._4_12_ = auVar142._4_12_;
      local_440._0_4_ = auVar112._0_4_;
      local_440._16_16_ = auVar164._16_16_;
      auVar112._4_4_ = auVar112._0_4_;
      auVar112._8_4_ = auVar112._0_4_;
      auVar112._12_4_ = auVar112._0_4_;
      auVar112._16_4_ = auVar112._0_4_;
      auVar112._20_4_ = auVar112._0_4_;
      auVar112._24_4_ = auVar112._0_4_;
      auVar112._28_4_ = auVar112._0_4_;
      auVar164 = vcmpps_avx(_DAT_02020f40,auVar112,1);
      auVar14 = vpermilps_avx(auVar18,0xaa);
      uVar127 = auVar14._0_8_;
      local_460._8_8_ = uVar127;
      local_460._0_8_ = uVar127;
      local_460._16_8_ = uVar127;
      local_460._24_8_ = uVar127;
      auVar19 = vpermilps_avx(auVar108,0xaa);
      uVar127 = auVar19._0_8_;
      local_100._8_8_ = uVar127;
      local_100._0_8_ = uVar127;
      local_100._16_8_ = uVar127;
      local_100._24_8_ = uVar127;
      auVar19 = vpermilps_avx(auVar107,0xaa);
      uVar127 = auVar19._0_8_;
      local_3e0._8_8_ = uVar127;
      local_3e0._0_8_ = uVar127;
      local_3e0._16_8_ = uVar127;
      local_3e0._24_8_ = uVar127;
      auVar19 = vshufps_avx(auVar142,auVar142,0xaa);
      uVar127 = auVar19._0_8_;
      register0x00001508 = uVar127;
      local_5e0 = uVar127;
      register0x00001510 = uVar127;
      register0x00001518 = uVar127;
      auVar210 = ZEXT3264(_local_5e0);
      auVar111 = auVar164 & auVar13;
      uVar96 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      local_580._0_16_ = ZEXT416(uVar96);
      fStack_538 = local_540;
      fStack_534 = fStack_53c;
      fStack_530 = local_540;
      fStack_52c = fStack_53c;
      fStack_528 = local_540;
      fStack_524 = fStack_53c;
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar111 >> 0x7f,0) == '\0') &&
            (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0xbf,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar111[0x1f]) {
        uVar98 = 0;
        auVar187 = ZEXT3264(local_2e0);
        auVar139 = ZEXT3264(local_620);
        auVar158 = ZEXT3264(local_600);
        auVar183 = ZEXT3264(local_640);
        auVar179 = ZEXT3264(CONCAT428(local_560,
                                      CONCAT424(local_560,
                                                CONCAT420(local_560,
                                                          CONCAT416(local_560,
                                                                    CONCAT412(local_560,
                                                                              CONCAT48(local_560,
                                                                                       CONCAT44(
                                                  local_560,local_560))))))));
        auVar194 = ZEXT3264(CONCAT428(fStack_53c,
                                      CONCAT424(local_540,
                                                CONCAT420(fStack_53c,
                                                          CONCAT416(local_540,
                                                                    CONCAT412(fStack_53c,
                                                                              CONCAT48(local_540,
                                                                                       uVar104))))))
                           );
        auVar206 = ZEXT3264(local_6c0);
        auVar217 = ZEXT3264(local_700);
      }
      else {
        local_380 = vandps_avx(auVar13,auVar164);
        fVar126 = auVar19._0_4_;
        fVar140 = auVar19._4_4_;
        auVar164._4_4_ = fVar140 * fVar76;
        auVar164._0_4_ = fVar126 * fVar75;
        auVar164._8_4_ = fVar126 * fVar77;
        auVar164._12_4_ = fVar140 * fVar78;
        auVar164._16_4_ = fVar126 * fVar79;
        auVar164._20_4_ = fVar140 * fVar80;
        auVar164._24_4_ = fVar126 * fVar81;
        auVar164._28_4_ = local_380._28_4_;
        auVar19 = vfmadd213ps_fma(auVar119,local_3e0,auVar164);
        auVar19 = vfmadd213ps_fma(auVar174,local_100,ZEXT1632(auVar19));
        auVar19 = vfmadd213ps_fma(auVar150,local_460,ZEXT1632(auVar19));
        auVar113._0_4_ = fVar126 * (float)local_7a0._0_4_;
        auVar113._4_4_ = fVar140 * (float)local_7a0._4_4_;
        auVar113._8_4_ = fVar126 * (float)auStack_798._0_4_;
        auVar113._12_4_ = fVar140 * (float)auStack_798._4_4_;
        auVar113._16_4_ = fVar126 * fStack_790;
        auVar113._20_4_ = fVar140 * fStack_78c;
        auVar113._24_4_ = fVar126 * fStack_788;
        auVar113._28_4_ = 0;
        auVar17 = vfmadd213ps_fma(auVar8,local_3e0,auVar113);
        auVar17 = vfmadd213ps_fma(local_720,local_100,ZEXT1632(auVar17));
        auVar164 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar174 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        fVar120 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar121 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar122 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar123 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar124 = *(float *)(bezier_basis0 + lVar22 + 0x1fac);
        fVar125 = *(float *)(bezier_basis0 + lVar22 + 0x1fb0);
        fVar75 = *(float *)(bezier_basis0 + lVar22 + 0x1fb4);
        auVar170._0_4_ = local_560 * fVar120;
        auVar170._4_4_ = local_560 * fVar121;
        auVar170._8_4_ = local_560 * fVar122;
        auVar170._12_4_ = local_560 * fVar123;
        auVar170._16_4_ = local_560 * fVar124;
        auVar170._20_4_ = local_560 * fVar125;
        auVar170._24_4_ = local_560 * fVar75;
        auVar170._28_4_ = 0;
        auVar24._4_4_ = fStack_53c * fVar121;
        auVar24._0_4_ = local_540 * fVar120;
        auVar24._8_4_ = local_540 * fVar122;
        auVar24._12_4_ = fStack_53c * fVar123;
        auVar24._16_4_ = local_540 * fVar124;
        auVar24._20_4_ = fStack_53c * fVar125;
        auVar24._24_4_ = local_540 * fVar75;
        auVar24._28_4_ = *(undefined4 *)(bezier_basis1 + lVar22 + 0xda8);
        auVar25._4_4_ = fVar121 * fVar140;
        auVar25._0_4_ = fVar120 * fVar126;
        auVar25._8_4_ = fVar122 * fVar126;
        auVar25._12_4_ = fVar123 * fVar140;
        auVar25._16_4_ = fVar124 * fVar126;
        auVar25._20_4_ = fVar125 * fVar140;
        auVar25._24_4_ = fVar75 * fVar126;
        auVar25._28_4_ = auVar118._28_4_;
        local_780._0_16_ = ZEXT416((uint)fVar141);
        local_780._16_16_ = auVar8._16_16_;
        auVar18 = vfmadd231ps_fma(auVar170,auVar174,local_600);
        auVar108 = vfmadd231ps_fma(auVar24,auVar174,local_640);
        auVar107 = vfmadd231ps_fma(auVar25,local_3e0,auVar174);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar119,local_6c0);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar119,local_620);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_100,auVar119);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar164,local_700);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar164,local_400);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_460,auVar164);
        fVar120 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar121 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar122 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar123 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar124 = *(float *)(bezier_basis1 + lVar22 + 0x1fac);
        fVar125 = *(float *)(bezier_basis1 + lVar22 + 0x1fb0);
        fVar75 = *(float *)(bezier_basis1 + lVar22 + 0x1fb4);
        auVar8._4_4_ = local_560 * fVar121;
        auVar8._0_4_ = local_560 * fVar120;
        auVar8._8_4_ = local_560 * fVar122;
        auVar8._12_4_ = local_560 * fVar123;
        auVar8._16_4_ = local_560 * fVar124;
        auVar8._20_4_ = local_560 * fVar125;
        auVar8._24_4_ = local_560 * fVar75;
        auVar8._28_4_ = local_560;
        auVar26._4_4_ = fStack_53c * fVar121;
        auVar26._0_4_ = local_540 * fVar120;
        auVar26._8_4_ = local_540 * fVar122;
        auVar26._12_4_ = fStack_53c * fVar123;
        auVar26._16_4_ = local_540 * fVar124;
        auVar26._20_4_ = fStack_53c * fVar125;
        auVar26._24_4_ = local_540 * fVar75;
        auVar26._28_4_ = fStack_53c;
        auVar27._4_4_ = fVar121 * fVar140;
        auVar27._0_4_ = fVar120 * fVar126;
        auVar27._8_4_ = fVar122 * fVar126;
        auVar27._12_4_ = fVar123 * fVar140;
        auVar27._16_4_ = fVar124 * fVar126;
        auVar27._20_4_ = fVar125 * fVar140;
        auVar27._24_4_ = fVar75 * fVar126;
        auVar27._28_4_ = auVar14._4_4_;
        auVar164 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar14 = vfmadd231ps_fma(auVar8,auVar164,local_600);
        auVar142 = vfmadd231ps_fma(auVar26,auVar164,local_640);
        auVar130 = vfmadd231ps_fma(auVar27,auVar164,local_3e0);
        auVar164 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar164,local_6c0);
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar164,local_620);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_100,auVar164);
        auVar164 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar164,local_700);
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar164,local_400);
        auVar133._8_4_ = 0x7fffffff;
        auVar133._0_8_ = 0x7fffffff7fffffff;
        auVar133._12_4_ = 0x7fffffff;
        auVar133._16_4_ = 0x7fffffff;
        auVar133._20_4_ = 0x7fffffff;
        auVar133._24_4_ = 0x7fffffff;
        auVar133._28_4_ = 0x7fffffff;
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_460,auVar164);
        auVar164 = vandps_avx(ZEXT1632(auVar18),auVar133);
        auVar8 = vandps_avx(ZEXT1632(auVar108),auVar133);
        auVar8 = vmaxps_avx(auVar164,auVar8);
        auVar164 = vandps_avx(ZEXT1632(auVar107),auVar133);
        auVar164 = vmaxps_avx(auVar8,auVar164);
        auVar148._4_4_ = fVar141;
        auVar148._0_4_ = fVar141;
        auVar148._8_4_ = fVar141;
        auVar148._12_4_ = fVar141;
        auVar148._16_4_ = fVar141;
        auVar148._20_4_ = fVar141;
        auVar148._24_4_ = fVar141;
        auVar148._28_4_ = fVar141;
        auVar164 = vcmpps_avx(auVar164,auVar148,1);
        auVar119 = vblendvps_avx(ZEXT1632(auVar18),auVar118,auVar164);
        auVar174 = vblendvps_avx(ZEXT1632(auVar108),local_360,auVar164);
        auVar164 = vandps_avx(ZEXT1632(auVar14),auVar133);
        auVar8 = vandps_avx(ZEXT1632(auVar142),auVar133);
        auVar150 = vmaxps_avx(auVar164,auVar8);
        auVar164 = vandps_avx(ZEXT1632(auVar130),auVar133);
        auVar164 = vmaxps_avx(auVar150,auVar164);
        auVar13 = vcmpps_avx(auVar164,auVar148,1);
        auVar164 = vblendvps_avx(ZEXT1632(auVar14),auVar118,auVar13);
        auVar150 = vblendvps_avx(ZEXT1632(auVar142),local_360,auVar13);
        auVar14 = vfmadd213ps_fma(auVar117,local_460,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(auVar119,auVar119,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar174,auVar174);
        auVar117 = vrsqrtps_avx(ZEXT1632(auVar17));
        fVar141 = auVar117._0_4_;
        fVar120 = auVar117._4_4_;
        fVar121 = auVar117._8_4_;
        fVar122 = auVar117._12_4_;
        fVar123 = auVar117._16_4_;
        fVar124 = auVar117._20_4_;
        fVar125 = auVar117._24_4_;
        auVar118._4_4_ = fVar120 * fVar120 * fVar120 * auVar17._4_4_ * -0.5;
        auVar118._0_4_ = fVar141 * fVar141 * fVar141 * auVar17._0_4_ * -0.5;
        auVar118._8_4_ = fVar121 * fVar121 * fVar121 * auVar17._8_4_ * -0.5;
        auVar118._12_4_ = fVar122 * fVar122 * fVar122 * auVar17._12_4_ * -0.5;
        auVar118._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar118._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar118._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar118._28_4_ = 0;
        auVar162._8_4_ = 0x3fc00000;
        auVar162._0_8_ = 0x3fc000003fc00000;
        auVar162._12_4_ = 0x3fc00000;
        auVar162._16_4_ = 0x3fc00000;
        auVar162._20_4_ = 0x3fc00000;
        auVar162._24_4_ = 0x3fc00000;
        auVar162._28_4_ = 0x3fc00000;
        auVar17 = vfmadd231ps_fma(auVar118,auVar162,auVar117);
        fVar141 = auVar17._0_4_;
        fVar120 = auVar17._4_4_;
        auVar28._4_4_ = auVar174._4_4_ * fVar120;
        auVar28._0_4_ = auVar174._0_4_ * fVar141;
        fVar121 = auVar17._8_4_;
        auVar28._8_4_ = auVar174._8_4_ * fVar121;
        fVar122 = auVar17._12_4_;
        auVar28._12_4_ = auVar174._12_4_ * fVar122;
        auVar28._16_4_ = auVar174._16_4_ * 0.0;
        auVar28._20_4_ = auVar174._20_4_ * 0.0;
        auVar28._24_4_ = auVar174._24_4_ * 0.0;
        auVar28._28_4_ = auVar117._28_4_;
        auVar29._4_4_ = -auVar119._4_4_ * fVar120;
        auVar29._0_4_ = -auVar119._0_4_ * fVar141;
        auVar29._8_4_ = -auVar119._8_4_ * fVar121;
        auVar29._12_4_ = -auVar119._12_4_ * fVar122;
        auVar29._16_4_ = -auVar119._16_4_ * 0.0;
        auVar29._20_4_ = -auVar119._20_4_ * 0.0;
        auVar29._24_4_ = -auVar119._24_4_ * 0.0;
        auVar29._28_4_ = auVar8._28_4_;
        auVar17 = vfmadd213ps_fma(auVar164,auVar164,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar150,auVar150);
        auVar8 = vrsqrtps_avx(ZEXT1632(auVar17));
        auVar30._28_4_ = auVar13._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
        fVar141 = auVar8._0_4_;
        fVar120 = auVar8._4_4_;
        fVar121 = auVar8._8_4_;
        fVar122 = auVar8._12_4_;
        fVar123 = auVar8._16_4_;
        fVar124 = auVar8._20_4_;
        fVar125 = auVar8._24_4_;
        auVar31._4_4_ = fVar120 * fVar120 * fVar120 * auVar17._4_4_ * -0.5;
        auVar31._0_4_ = fVar141 * fVar141 * fVar141 * auVar17._0_4_ * -0.5;
        auVar31._8_4_ = fVar121 * fVar121 * fVar121 * auVar17._8_4_ * -0.5;
        auVar31._12_4_ = fVar122 * fVar122 * fVar122 * auVar17._12_4_ * -0.5;
        auVar31._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar31._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar31._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar31._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar31,auVar162,auVar8);
        fVar141 = auVar17._0_4_;
        fVar120 = auVar17._4_4_;
        auVar32._4_4_ = auVar150._4_4_ * fVar120;
        auVar32._0_4_ = auVar150._0_4_ * fVar141;
        fVar121 = auVar17._8_4_;
        auVar32._8_4_ = auVar150._8_4_ * fVar121;
        fVar122 = auVar17._12_4_;
        auVar32._12_4_ = auVar150._12_4_ * fVar122;
        auVar32._16_4_ = auVar150._16_4_ * 0.0;
        auVar32._20_4_ = auVar150._20_4_ * 0.0;
        auVar32._24_4_ = auVar150._24_4_ * 0.0;
        auVar32._28_4_ = 0;
        auVar33._4_4_ = -auVar164._4_4_ * fVar120;
        auVar33._0_4_ = -auVar164._0_4_ * fVar141;
        auVar33._8_4_ = -auVar164._8_4_ * fVar121;
        auVar33._12_4_ = -auVar164._12_4_ * fVar122;
        auVar33._16_4_ = -auVar164._16_4_ * 0.0;
        auVar33._20_4_ = -auVar164._20_4_ * 0.0;
        auVar33._24_4_ = -auVar164._24_4_ * 0.0;
        auVar33._28_4_ = auVar150._28_4_;
        auVar34._28_4_ = auVar8._28_4_;
        auVar34._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
        auVar17 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar15),auVar131);
        local_720 = ZEXT1632(auVar17);
        auVar164 = ZEXT1632(auVar15);
        auVar17 = vfmadd213ps_fma(auVar29,auVar164,_local_420);
        auVar18 = vfmadd213ps_fma(auVar30,auVar164,ZEXT1632(auVar14));
        auVar142 = vfnmadd213ps_fma(auVar28,auVar164,auVar131);
        auVar108 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar16),auVar110);
        auVar130 = vfnmadd213ps_fma(auVar29,auVar164,_local_420);
        auVar164 = ZEXT1632(auVar16);
        auVar107 = vfmadd213ps_fma(auVar33,auVar164,auVar147);
        auVar132 = ZEXT1632(auVar15);
        auVar105 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar132,auVar30);
        auVar14 = vfmadd213ps_fma(auVar34,auVar164,ZEXT1632(auVar19));
        auVar153 = vfnmadd213ps_fma(auVar32,auVar164,auVar110);
        auVar160 = vfnmadd213ps_fma(auVar33,auVar164,auVar147);
        local_660 = ZEXT1632(auVar16);
        auVar128 = vfnmadd231ps_fma(ZEXT1632(auVar19),local_660,auVar34);
        auVar164 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar130));
        auVar8 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar105));
        auVar110._4_4_ = auVar105._4_4_ * auVar164._4_4_;
        auVar110._0_4_ = auVar105._0_4_ * auVar164._0_4_;
        auVar110._8_4_ = auVar105._8_4_ * auVar164._8_4_;
        auVar110._12_4_ = auVar105._12_4_ * auVar164._12_4_;
        auVar110._16_4_ = auVar164._16_4_ * 0.0;
        auVar110._20_4_ = auVar164._20_4_ * 0.0;
        auVar110._24_4_ = auVar164._24_4_ * 0.0;
        auVar110._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar130),auVar8);
        auVar131._4_4_ = auVar142._4_4_ * auVar8._4_4_;
        auVar131._0_4_ = auVar142._0_4_ * auVar8._0_4_;
        auVar131._8_4_ = auVar142._8_4_ * auVar8._8_4_;
        auVar131._12_4_ = auVar142._12_4_ * auVar8._12_4_;
        auVar131._16_4_ = auVar8._16_4_ * 0.0;
        auVar131._20_4_ = auVar8._20_4_ * 0.0;
        auVar131._24_4_ = auVar8._24_4_ * 0.0;
        auVar131._28_4_ = auVar8._28_4_;
        auVar150 = ZEXT1632(auVar142);
        auVar8 = vsubps_avx(ZEXT1632(auVar108),auVar150);
        auVar19 = vfmsub231ps_fma(auVar131,ZEXT1632(auVar105),auVar8);
        auVar147._4_4_ = auVar130._4_4_ * auVar8._4_4_;
        auVar147._0_4_ = auVar130._0_4_ * auVar8._0_4_;
        auVar147._8_4_ = auVar130._8_4_ * auVar8._8_4_;
        auVar147._12_4_ = auVar130._12_4_ * auVar8._12_4_;
        auVar147._16_4_ = auVar8._16_4_ * 0.0;
        auVar147._20_4_ = auVar8._20_4_ * 0.0;
        auVar147._24_4_ = auVar8._24_4_ * 0.0;
        auVar147._28_4_ = auVar8._28_4_;
        auVar142 = vfmsub231ps_fma(auVar147,auVar150,auVar164);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar142),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar111 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,2);
        local_760 = vblendvps_avx(ZEXT1632(auVar153),local_720,auVar111);
        auVar164 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar17),auVar111);
        auVar8 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar18),auVar111);
        auVar117 = vblendvps_avx(auVar150,ZEXT1632(auVar108),auVar111);
        auVar119 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar107),auVar111);
        auVar174 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar14),auVar111);
        auVar150 = vblendvps_avx(ZEXT1632(auVar108),auVar150,auVar111);
        auVar13 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar130),auVar111);
        auVar19 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
        auVar118 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar105),auVar111);
        auVar20 = vsubps_avx(auVar150,local_760);
        auVar13 = vsubps_avx(auVar13,auVar164);
        auVar21 = vsubps_avx(auVar118,auVar8);
        auVar137 = vsubps_avx(local_760,auVar117);
        auVar177 = vsubps_avx(auVar164,auVar119);
        auVar110 = vsubps_avx(auVar8,auVar174);
        auVar35._4_4_ = auVar21._4_4_ * local_760._4_4_;
        auVar35._0_4_ = auVar21._0_4_ * local_760._0_4_;
        auVar35._8_4_ = auVar21._8_4_ * local_760._8_4_;
        auVar35._12_4_ = auVar21._12_4_ * local_760._12_4_;
        auVar35._16_4_ = auVar21._16_4_ * local_760._16_4_;
        auVar35._20_4_ = auVar21._20_4_ * local_760._20_4_;
        auVar35._24_4_ = auVar21._24_4_ * local_760._24_4_;
        auVar35._28_4_ = auVar118._28_4_;
        auVar14 = vfmsub231ps_fma(auVar35,auVar8,auVar20);
        auVar36._4_4_ = auVar20._4_4_ * auVar164._4_4_;
        auVar36._0_4_ = auVar20._0_4_ * auVar164._0_4_;
        auVar36._8_4_ = auVar20._8_4_ * auVar164._8_4_;
        auVar36._12_4_ = auVar20._12_4_ * auVar164._12_4_;
        auVar36._16_4_ = auVar20._16_4_ * auVar164._16_4_;
        auVar36._20_4_ = auVar20._20_4_ * auVar164._20_4_;
        auVar36._24_4_ = auVar20._24_4_ * auVar164._24_4_;
        auVar36._28_4_ = auVar150._28_4_;
        auVar16 = vfmsub231ps_fma(auVar36,local_760,auVar13);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar114._0_4_ = auVar13._0_4_ * auVar8._0_4_;
        auVar114._4_4_ = auVar13._4_4_ * auVar8._4_4_;
        auVar114._8_4_ = auVar13._8_4_ * auVar8._8_4_;
        auVar114._12_4_ = auVar13._12_4_ * auVar8._12_4_;
        auVar114._16_4_ = auVar13._16_4_ * auVar8._16_4_;
        auVar114._20_4_ = auVar13._20_4_ * auVar8._20_4_;
        auVar114._24_4_ = auVar13._24_4_ * auVar8._24_4_;
        auVar114._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar114,auVar164,auVar21);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar152 = ZEXT1664(auVar16);
        auVar115._0_4_ = auVar110._0_4_ * auVar117._0_4_;
        auVar115._4_4_ = auVar110._4_4_ * auVar117._4_4_;
        auVar115._8_4_ = auVar110._8_4_ * auVar117._8_4_;
        auVar115._12_4_ = auVar110._12_4_ * auVar117._12_4_;
        auVar115._16_4_ = auVar110._16_4_ * auVar117._16_4_;
        auVar115._20_4_ = auVar110._20_4_ * auVar117._20_4_;
        auVar115._24_4_ = auVar110._24_4_ * auVar117._24_4_;
        auVar115._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar115,auVar137,auVar174);
        auVar37._4_4_ = auVar177._4_4_ * auVar174._4_4_;
        auVar37._0_4_ = auVar177._0_4_ * auVar174._0_4_;
        auVar37._8_4_ = auVar177._8_4_ * auVar174._8_4_;
        auVar37._12_4_ = auVar177._12_4_ * auVar174._12_4_;
        auVar37._16_4_ = auVar177._16_4_ * auVar174._16_4_;
        auVar37._20_4_ = auVar177._20_4_ * auVar174._20_4_;
        auVar37._24_4_ = auVar177._24_4_ * auVar174._24_4_;
        auVar37._28_4_ = auVar174._28_4_;
        auVar17 = vfmsub231ps_fma(auVar37,auVar119,auVar110);
        auVar38._4_4_ = auVar137._4_4_ * auVar119._4_4_;
        auVar38._0_4_ = auVar137._0_4_ * auVar119._0_4_;
        auVar38._8_4_ = auVar137._8_4_ * auVar119._8_4_;
        auVar38._12_4_ = auVar137._12_4_ * auVar119._12_4_;
        auVar38._16_4_ = auVar137._16_4_ * auVar119._16_4_;
        auVar38._20_4_ = auVar137._20_4_ * auVar119._20_4_;
        auVar38._24_4_ = auVar137._24_4_ * auVar119._24_4_;
        auVar38._28_4_ = auVar119._28_4_;
        auVar18 = vfmsub231ps_fma(auVar38,auVar177,auVar117);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar117 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
        auVar117 = vcmpps_avx(auVar117,ZEXT832(0) << 0x20,2);
        auVar14 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar19 = vpand_avx(auVar19,auVar14);
        auVar117 = vpmovsxwd_avx2(auVar19);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) {
LAB_016470cc:
          auVar187 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar215._8_4_ = local_540;
          auVar215._0_8_ = uVar104;
          auVar215._12_4_ = fStack_53c;
          auVar215._16_4_ = local_540;
          auVar215._20_4_ = fStack_53c;
          auVar215._24_4_ = local_540;
          auVar215._28_4_ = fStack_53c;
        }
        else {
          auVar39._4_4_ = auVar13._4_4_ * auVar110._4_4_;
          auVar39._0_4_ = auVar13._0_4_ * auVar110._0_4_;
          auVar39._8_4_ = auVar13._8_4_ * auVar110._8_4_;
          auVar39._12_4_ = auVar13._12_4_ * auVar110._12_4_;
          auVar39._16_4_ = auVar13._16_4_ * auVar110._16_4_;
          auVar39._20_4_ = auVar13._20_4_ * auVar110._20_4_;
          auVar39._24_4_ = auVar13._24_4_ * auVar110._24_4_;
          auVar39._28_4_ = auVar117._28_4_;
          auVar107 = vfmsub231ps_fma(auVar39,auVar177,auVar21);
          auVar134._0_4_ = auVar137._0_4_ * auVar21._0_4_;
          auVar134._4_4_ = auVar137._4_4_ * auVar21._4_4_;
          auVar134._8_4_ = auVar137._8_4_ * auVar21._8_4_;
          auVar134._12_4_ = auVar137._12_4_ * auVar21._12_4_;
          auVar134._16_4_ = auVar137._16_4_ * auVar21._16_4_;
          auVar134._20_4_ = auVar137._20_4_ * auVar21._20_4_;
          auVar134._24_4_ = auVar137._24_4_ * auVar21._24_4_;
          auVar134._28_4_ = 0;
          auVar108 = vfmsub231ps_fma(auVar134,auVar20,auVar110);
          auVar40._4_4_ = auVar20._4_4_ * auVar177._4_4_;
          auVar40._0_4_ = auVar20._0_4_ * auVar177._0_4_;
          auVar40._8_4_ = auVar20._8_4_ * auVar177._8_4_;
          auVar40._12_4_ = auVar20._12_4_ * auVar177._12_4_;
          auVar40._16_4_ = auVar20._16_4_ * auVar177._16_4_;
          auVar40._20_4_ = auVar20._20_4_ * auVar177._20_4_;
          auVar40._24_4_ = auVar20._24_4_ * auVar177._24_4_;
          auVar40._28_4_ = auVar20._28_4_;
          auVar142 = vfmsub231ps_fma(auVar40,auVar137,auVar13);
          auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar142));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar107),_DAT_02020f00);
          auVar117 = vrcpps_avx(ZEXT1632(auVar18));
          auVar205._8_4_ = 0x3f800000;
          auVar205._0_8_ = &DAT_3f8000003f800000;
          auVar205._12_4_ = 0x3f800000;
          auVar205._16_4_ = 0x3f800000;
          auVar205._20_4_ = 0x3f800000;
          auVar205._24_4_ = 0x3f800000;
          auVar205._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar18),auVar205);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar117,auVar117);
          auVar41._4_4_ = auVar142._4_4_ * auVar8._4_4_;
          auVar41._0_4_ = auVar142._0_4_ * auVar8._0_4_;
          auVar41._8_4_ = auVar142._8_4_ * auVar8._8_4_;
          auVar41._12_4_ = auVar142._12_4_ * auVar8._12_4_;
          auVar41._16_4_ = auVar8._16_4_ * 0.0;
          auVar41._20_4_ = auVar8._20_4_ * 0.0;
          auVar41._24_4_ = auVar8._24_4_ * 0.0;
          auVar41._28_4_ = auVar8._28_4_;
          auVar108 = vfmadd231ps_fma(auVar41,auVar164,ZEXT1632(auVar108));
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT1632(auVar107),local_760);
          fVar120 = auVar14._0_4_;
          fVar121 = auVar14._4_4_;
          fVar122 = auVar14._8_4_;
          fVar123 = auVar14._12_4_;
          auVar42._28_4_ = auVar164._28_4_;
          auVar42._0_28_ =
               ZEXT1628(CONCAT412(fVar123 * auVar108._12_4_,
                                  CONCAT48(fVar122 * auVar108._8_4_,
                                           CONCAT44(fVar121 * auVar108._4_4_,
                                                    fVar120 * auVar108._0_4_))));
          auVar116._4_4_ = uVar96;
          auVar116._0_4_ = uVar96;
          auVar116._8_4_ = uVar96;
          auVar116._12_4_ = uVar96;
          auVar116._16_4_ = uVar96;
          auVar116._20_4_ = uVar96;
          auVar116._24_4_ = uVar96;
          auVar116._28_4_ = uVar96;
          fVar141 = ray->tfar;
          auVar135._4_4_ = fVar141;
          auVar135._0_4_ = fVar141;
          auVar135._8_4_ = fVar141;
          auVar135._12_4_ = fVar141;
          auVar135._16_4_ = fVar141;
          auVar135._20_4_ = fVar141;
          auVar135._24_4_ = fVar141;
          auVar135._28_4_ = fVar141;
          auVar164 = vcmpps_avx(auVar116,auVar42,2);
          auVar8 = vcmpps_avx(auVar42,auVar135,2);
          auVar164 = vandps_avx(auVar8,auVar164);
          auVar14 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
          auVar19 = vpand_avx(auVar19,auVar14);
          auVar164 = vpmovsxwd_avx2(auVar19);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar164 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar164[0x1f]) goto LAB_016470cc;
          auVar164 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
          auVar14 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
          auVar19 = vpand_avx(auVar19,auVar14);
          auVar164 = vpmovsxwd_avx2(auVar19);
          auVar187 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar215._8_4_ = local_540;
          auVar215._0_8_ = uVar104;
          auVar215._12_4_ = fStack_53c;
          auVar215._16_4_ = local_540;
          auVar215._20_4_ = fStack_53c;
          auVar215._24_4_ = local_540;
          auVar215._28_4_ = fStack_53c;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            auVar117 = ZEXT1632(CONCAT412(fVar123 * auVar16._12_4_,
                                          CONCAT48(fVar122 * auVar16._8_4_,
                                                   CONCAT44(fVar121 * auVar16._4_4_,
                                                            fVar120 * auVar16._0_4_))));
            auVar119 = ZEXT1632(CONCAT412(fVar123 * auVar17._12_4_,
                                          CONCAT48(fVar122 * auVar17._8_4_,
                                                   CONCAT44(fVar121 * auVar17._4_4_,
                                                            fVar120 * auVar17._0_4_))));
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = &DAT_3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar163._16_4_ = 0x3f800000;
            auVar163._20_4_ = 0x3f800000;
            auVar163._24_4_ = 0x3f800000;
            auVar163._28_4_ = 0x3f800000;
            auVar8 = vsubps_avx(auVar163,auVar117);
            auVar152 = ZEXT3264(auVar8);
            _local_1a0 = vblendvps_avx(auVar8,auVar117,auVar111);
            auVar8 = vsubps_avx(auVar163,auVar119);
            local_3a0 = vblendvps_avx(auVar8,auVar119,auVar111);
            auVar187 = ZEXT3264(auVar164);
            local_2e0 = auVar42;
          }
        }
        auVar217 = ZEXT3264(local_700);
        auVar210 = ZEXT3264(_local_5e0);
        auVar206 = ZEXT3264(local_6c0);
        auVar164 = auVar187._0_32_;
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0x7f,0) == '\0') &&
              (auVar187 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar164 >> 0xbf,0) == '\0') &&
            (auVar187 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar187[0x1f]) {
          uVar98 = 0;
          auVar139 = ZEXT3264(local_620);
          auVar158 = ZEXT3264(local_600);
          auVar179 = ZEXT3264(CONCAT428(local_560,
                                        CONCAT424(local_560,
                                                  CONCAT420(local_560,
                                                            CONCAT416(local_560,
                                                                      CONCAT412(local_560,
                                                                                CONCAT48(local_560,
                                                                                         CONCAT44(
                                                  local_560,local_560))))))));
          auVar211 = ZEXT1664(local_780._0_16_);
          auVar183 = ZEXT3264(local_640);
          auVar194 = ZEXT3264(auVar215);
          auVar187 = ZEXT3264(local_2e0);
        }
        else {
          auVar8 = vsubps_avx(local_660,auVar132);
          auVar19 = vfmadd213ps_fma(auVar8,_local_1a0,auVar132);
          fVar141 = pre->depth_scale;
          auVar43._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar141;
          auVar43._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar141;
          auVar43._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar141;
          auVar43._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar141;
          auVar43._16_4_ = fVar141 * 0.0;
          auVar43._20_4_ = fVar141 * 0.0;
          auVar43._24_4_ = fVar141 * 0.0;
          auVar43._28_4_ = 0;
          auVar187 = ZEXT3264(local_2e0);
          auVar8 = vcmpps_avx(local_2e0,auVar43,6);
          auVar117 = auVar164 & auVar8;
          auVar179 = ZEXT3264(CONCAT428(local_560,
                                        CONCAT424(local_560,
                                                  CONCAT420(local_560,
                                                            CONCAT416(local_560,
                                                                      CONCAT412(local_560,
                                                                                CONCAT48(local_560,
                                                                                         CONCAT44(
                                                  local_560,local_560))))))));
          auVar183 = ZEXT3264(local_640);
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            uVar98 = 0;
            auVar139 = ZEXT3264(local_620);
            auVar158 = ZEXT3264(local_600);
            auVar211 = ZEXT1664(local_780._0_16_);
            auVar194 = ZEXT3264(auVar215);
          }
          else {
            local_260 = vandps_avx(auVar8,auVar164);
            auVar136._8_4_ = 0xbf800000;
            auVar136._0_8_ = 0xbf800000bf800000;
            auVar136._12_4_ = 0xbf800000;
            auVar136._16_4_ = 0xbf800000;
            auVar136._20_4_ = 0xbf800000;
            auVar136._24_4_ = 0xbf800000;
            auVar136._28_4_ = 0xbf800000;
            auVar149._8_4_ = 0x40000000;
            auVar149._0_8_ = 0x4000000040000000;
            auVar149._12_4_ = 0x40000000;
            auVar149._16_4_ = 0x40000000;
            auVar149._20_4_ = 0x40000000;
            auVar149._24_4_ = 0x40000000;
            auVar149._28_4_ = 0x40000000;
            auVar19 = vfmadd213ps_fma(local_3a0,auVar149,auVar136);
            local_320 = _local_1a0;
            local_300 = ZEXT1632(auVar19);
            local_2c0 = 0;
            local_2bc = iVar10;
            local_2b0 = *(undefined8 *)pPVar1;
            uStack_2a8 = *(undefined8 *)(pPVar1 + 8);
            local_2a0 = local_490._0_8_;
            uStack_298 = local_490._8_8_;
            local_290 = local_4a0._0_8_;
            uStack_288 = local_4a0._8_8_;
            auVar152 = ZEXT1664(local_4b0);
            local_280 = local_4b0;
            local_3a0 = ZEXT1632(auVar19);
            auVar164 = local_3a0;
            if ((pGVar11->mask & ray->mask) == 0) {
              uVar98 = 0;
              auVar158 = ZEXT3264(local_600);
              auVar211 = ZEXT1664(local_780._0_16_);
              auVar194 = ZEXT3264(auVar215);
              local_4a0 = auVar129;
              local_490 = auVar106;
            }
            else {
              auVar158 = ZEXT3264(local_600);
              auVar211 = ZEXT1664(local_780._0_16_);
              auVar194 = ZEXT3264(auVar215);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar98 = CONCAT71((int7)(uVar98 >> 8),1), local_4a0 = auVar129,
                 local_490 = auVar106, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar141 = 1.0 / auVar112._0_4_;
                auVar152 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar141,CONCAT420(fVar141,CONCAT416(
                                                  fVar141,CONCAT412(fVar141,CONCAT48(fVar141,
                                                  CONCAT44(fVar141,fVar141))))))));
                local_240[0] = fVar141 * ((float)local_1a0._0_4_ + 0.0);
                local_240[1] = fVar141 * ((float)local_1a0._4_4_ + 1.0);
                local_240[2] = fVar141 * (fStack_198 + 2.0);
                local_240[3] = fVar141 * (fStack_194 + 3.0);
                fStack_230 = fVar141 * (fStack_190 + 4.0);
                fStack_22c = fVar141 * (fStack_18c + 5.0);
                fStack_228 = fVar141 * (fStack_188 + 6.0);
                fStack_224 = fStack_184 + 7.0;
                local_3a0._0_8_ = auVar19._0_8_;
                local_3a0._8_8_ = auVar19._8_8_;
                local_220 = local_3a0._0_8_;
                uStack_218 = local_3a0._8_8_;
                uStack_210 = 0;
                uStack_208 = 0;
                local_200 = local_2e0;
                uVar96 = vmovmskps_avx(local_260);
                uVar98 = CONCAT71((int7)(uVar98 >> 8),uVar96 != 0);
                local_4a0 = auVar129;
                local_490 = auVar106;
                local_3a0 = auVar164;
                if (uVar96 != 0) {
                  uVar95 = (ulong)(uVar96 & 0xff);
                  _local_7a0 = ZEXT1632(CONCAT88(auVar15._8_8_,uVar95));
                  lVar99 = 0;
                  for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
                    lVar99 = lVar99 + 1;
                  }
                  local_4e0 = ZEXT1632(local_490);
                  _local_500 = ZEXT1632(local_4a0);
                  _local_520 = ZEXT1632(local_4b0);
                  local_6e0 = local_2e0;
                  local_738 = pPVar100;
                  local_7b8 = context;
                  local_7b0 = ray;
                  do {
                    local_720._0_4_ = (int)uVar98;
                    local_5a4 = local_240[lVar99];
                    local_5a0 = *(undefined4 *)((long)&local_220 + lVar99 * 4);
                    local_660._0_4_ = ray->tfar;
                    local_760._0_8_ = lVar99;
                    ray->tfar = *(float *)(local_200 + lVar99 * 4);
                    local_690.context = context->user;
                    fVar120 = 1.0 - local_5a4;
                    fVar141 = fVar120 * fVar120 * -3.0;
                    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar120 * fVar120)),
                                              ZEXT416((uint)(local_5a4 * fVar120)),
                                              ZEXT416(0xc0000000));
                    auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar120)),
                                              ZEXT416((uint)(local_5a4 * local_5a4)),
                                              ZEXT416(0x40000000));
                    fVar120 = auVar19._0_4_ * 3.0;
                    fVar121 = auVar14._0_4_ * 3.0;
                    fVar122 = local_5a4 * local_5a4 * 3.0;
                    auVar168._0_4_ = fVar122 * (float)local_520._0_4_;
                    auVar168._4_4_ = fVar122 * (float)local_520._4_4_;
                    auVar168._8_4_ = fVar122 * fStack_518;
                    auVar168._12_4_ = fVar122 * fStack_514;
                    auVar143._4_4_ = fVar121;
                    auVar143._0_4_ = fVar121;
                    auVar143._8_4_ = fVar121;
                    auVar143._12_4_ = fVar121;
                    auVar19 = vfmadd132ps_fma(auVar143,auVar168,_local_500);
                    auVar154._4_4_ = fVar120;
                    auVar154._0_4_ = fVar120;
                    auVar154._8_4_ = fVar120;
                    auVar154._12_4_ = fVar120;
                    auVar19 = vfmadd132ps_fma(auVar154,auVar19,local_4e0._0_16_);
                    auVar144._4_4_ = fVar141;
                    auVar144._0_4_ = fVar141;
                    auVar144._8_4_ = fVar141;
                    auVar144._12_4_ = fVar141;
                    auVar87._8_8_ = uStack_698;
                    auVar87._0_8_ = local_6a0;
                    auVar19 = vfmadd132ps_fma(auVar144,auVar19,auVar87);
                    auVar152 = ZEXT1664(auVar19);
                    local_5b0 = vmovlps_avx(auVar19);
                    local_5a8 = vextractps_avx(auVar19,2);
                    local_59c = local_7a4;
                    local_598 = (int)local_728;
                    local_594 = (local_690.context)->instID[0];
                    local_590 = (local_690.context)->instPrimID[0];
                    local_7bc = -1;
                    local_690.valid = &local_7bc;
                    local_690.geometryUserPtr = pGVar11->userPtr;
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_5b0;
                    local_690.N = 1;
                    if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016461dd:
                      p_Var12 = context->args->filter;
                      if (p_Var12 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                          auVar152 = ZEXT1664(auVar152._0_16_);
                          (*p_Var12)(&local_690);
                          auVar210 = ZEXT3264(_local_5e0);
                          auVar217 = ZEXT3264(local_700);
                          auVar206 = ZEXT3264(local_6c0);
                          auVar194 = ZEXT3264(CONCAT428(fStack_524,
                                                        CONCAT424(fStack_528,
                                                                  CONCAT420(fStack_52c,
                                                                            CONCAT416(fStack_530,
                                                                                      CONCAT412(
                                                  fStack_534,
                                                  CONCAT48(fStack_538,CONCAT44(fStack_53c,local_540)
                                                          )))))));
                          auVar183 = ZEXT3264(local_640);
                          auVar187 = ZEXT3264(local_6e0);
                          context = local_7b8;
                          pre = local_730;
                          pPVar100 = local_738;
                          ray = local_7b0;
                        }
                        if (*local_690.valid == 0) goto LAB_0164627a;
                      }
                      uVar98 = (ulong)(uint)local_720._0_4_;
                      break;
                    }
                    auVar152 = ZEXT1664(auVar19);
                    (*pGVar11->occlusionFilterN)(&local_690);
                    auVar210 = ZEXT3264(_local_5e0);
                    auVar217 = ZEXT3264(local_700);
                    auVar206 = ZEXT3264(local_6c0);
                    auVar194 = ZEXT3264(CONCAT428(fStack_524,
                                                  CONCAT424(fStack_528,
                                                            CONCAT420(fStack_52c,
                                                                      CONCAT416(fStack_530,
                                                                                CONCAT412(fStack_534
                                                                                          ,CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
                    auVar183 = ZEXT3264(local_640);
                    auVar187 = ZEXT3264(local_6e0);
                    context = local_7b8;
                    pre = local_730;
                    pPVar100 = local_738;
                    ray = local_7b0;
                    if (*local_690.valid != 0) goto LAB_016461dd;
LAB_0164627a:
                    ray->tfar = (float)local_660._0_4_;
                    uVar95 = (ulong)local_7a0 ^ 1L << (local_760._0_8_ & 0x3f);
                    local_7a0 = (undefined1  [8])uVar95;
                    lVar99 = 0;
                    for (uVar98 = uVar95; (uVar98 & 1) == 0;
                        uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                      lVar99 = lVar99 + 1;
                    }
                    uVar98 = CONCAT71((int7)(uVar95 >> 8),uVar95 != 0);
                  } while (uVar95 != 0);
                }
                uVar98 = uVar98 & 0xffffffffffffff01;
                auVar158 = ZEXT3264(local_600);
                auVar179 = ZEXT3264(CONCAT428(fStack_544,
                                              CONCAT424(fStack_548,
                                                        CONCAT420(fStack_54c,
                                                                  CONCAT416(fStack_550,
                                                                            CONCAT412(fStack_554,
                                                                                      CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
                auVar211 = ZEXT1664(local_780._0_16_);
              }
            }
            auVar139 = ZEXT3264(local_620);
          }
        }
      }
      local_7b8 = context;
      local_738 = pPVar100;
      local_7b0 = ray;
      if (8 < iVar10) {
        local_360._4_4_ = iVar10;
        local_360._0_4_ = iVar10;
        local_360._8_4_ = iVar10;
        local_360._12_4_ = iVar10;
        local_360._16_4_ = iVar10;
        local_360._20_4_ = iVar10;
        local_360._24_4_ = iVar10;
        local_360._28_4_ = iVar10;
        local_140 = auVar211._0_4_;
        uStack_13c = local_140;
        uStack_138 = local_140;
        uStack_134 = local_140;
        uStack_130 = local_140;
        uStack_12c = local_140;
        uStack_128 = local_140;
        uStack_124 = local_140;
        local_160 = local_580._0_4_;
        uStack_15c = local_580._0_4_;
        uStack_158 = local_580._0_4_;
        uStack_154 = local_580._0_4_;
        uStack_150 = local_580._0_4_;
        uStack_14c = local_580._0_4_;
        uStack_148 = local_580._0_4_;
        uStack_144 = local_580._0_4_;
        local_180 = 1.0 / (float)local_440._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        lVar99 = 8;
        local_6e0 = auVar187._0_32_;
        _local_5e0 = auVar210._0_32_;
        uVar95 = uVar98;
        do {
          local_720._0_4_ = (int)uVar95;
          auVar164 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 * 4 + lVar22);
          auVar8 = *(undefined1 (*) [32])(lVar22 + 0x2227768 + lVar99 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar22 + 0x2227bec + lVar99 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar22 + 0x2228070 + lVar99 * 4);
          fVar75 = *(float *)*pauVar2;
          fVar76 = *(float *)(*pauVar2 + 4);
          fVar77 = *(float *)(*pauVar2 + 8);
          fVar78 = *(float *)(*pauVar2 + 0xc);
          fVar79 = *(float *)(*pauVar2 + 0x10);
          fVar80 = *(float *)(*pauVar2 + 0x14);
          fVar81 = *(float *)(*pauVar2 + 0x18);
          auVar92 = *(undefined1 (*) [28])*pauVar2;
          auVar212._0_4_ = fVar75 * auVar179._0_4_;
          auVar212._4_4_ = fVar76 * auVar179._4_4_;
          auVar212._8_4_ = fVar77 * auVar179._8_4_;
          auVar212._12_4_ = fVar78 * auVar179._12_4_;
          auVar212._16_4_ = fVar79 * auVar179._16_4_;
          auVar212._20_4_ = fVar80 * auVar179._20_4_;
          auVar212._28_36_ = auVar211._28_36_;
          auVar212._24_4_ = fVar81 * auVar179._24_4_;
          fVar188 = auVar194._0_4_;
          auVar211._0_4_ = fVar188 * fVar75;
          fVar195 = auVar194._4_4_;
          auVar211._4_4_ = fVar195 * fVar76;
          fVar196 = auVar194._8_4_;
          auVar211._8_4_ = fVar196 * fVar77;
          fVar197 = auVar194._12_4_;
          auVar211._12_4_ = fVar197 * fVar78;
          fVar198 = auVar194._16_4_;
          auVar211._16_4_ = fVar198 * fVar79;
          fVar199 = auVar194._20_4_;
          auVar211._20_4_ = fVar199 * fVar80;
          auVar211._28_36_ = auVar152._28_36_;
          fVar200 = auVar194._24_4_;
          auVar211._24_4_ = fVar200 * fVar81;
          auVar19 = vfmadd231ps_fma(auVar212._0_32_,auVar117,auVar158._0_32_);
          auVar110 = auVar183._0_32_;
          auVar14 = vfmadd231ps_fma(auVar211._0_32_,auVar117,auVar110);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar8,auVar206._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar8,auVar139._0_32_);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar164,auVar217._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar164,local_400);
          auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 * 4 + lVar22);
          auVar174 = *(undefined1 (*) [32])(lVar22 + 0x2229b88 + lVar99 * 4);
          auVar150 = *(undefined1 (*) [32])(lVar22 + 0x222a00c + lVar99 * 4);
          pauVar3 = (undefined1 (*) [28])(lVar22 + 0x222a490 + lVar99 * 4);
          fVar126 = *(float *)*pauVar3;
          fVar140 = *(float *)(*pauVar3 + 4);
          fVar82 = *(float *)(*pauVar3 + 8);
          fVar83 = *(float *)(*pauVar3 + 0xc);
          fVar84 = *(float *)(*pauVar3 + 0x10);
          fVar85 = *(float *)(*pauVar3 + 0x14);
          fVar86 = *(float *)(*pauVar3 + 0x18);
          auVar93 = *pauVar3;
          auVar183._0_4_ = auVar179._0_4_ * fVar126;
          auVar183._4_4_ = auVar179._4_4_ * fVar140;
          auVar183._8_4_ = auVar179._8_4_ * fVar82;
          auVar183._12_4_ = auVar179._12_4_ * fVar83;
          auVar183._16_4_ = auVar179._16_4_ * fVar84;
          auVar183._20_4_ = auVar179._20_4_ * fVar85;
          auVar183._28_36_ = auVar210._28_36_;
          auVar183._24_4_ = auVar179._24_4_ * fVar86;
          auVar152._0_4_ = fVar188 * fVar126;
          auVar152._4_4_ = fVar195 * fVar140;
          auVar152._8_4_ = fVar196 * fVar82;
          auVar152._12_4_ = fVar197 * fVar83;
          auVar152._16_4_ = fVar198 * fVar84;
          auVar152._20_4_ = fVar199 * fVar85;
          auVar152._28_36_ = auVar179._28_36_;
          auVar152._24_4_ = fVar200 * fVar86;
          auVar15 = vfmadd231ps_fma(auVar183._0_32_,auVar150,auVar158._0_32_);
          auVar16 = vfmadd231ps_fma(auVar152._0_32_,auVar150,auVar110);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar174,auVar206._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar174,auVar139._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,auVar217._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar119,local_400);
          auVar112 = ZEXT1632(auVar15);
          auVar131 = ZEXT1632(auVar19);
          auVar118 = vsubps_avx(auVar112,auVar131);
          auVar177 = ZEXT1632(auVar16);
          local_580 = ZEXT1632(auVar14);
          auVar111 = vsubps_avx(auVar177,local_580);
          auVar74._4_4_ = auVar118._4_4_ * auVar14._4_4_;
          auVar74._0_4_ = auVar118._0_4_ * auVar14._0_4_;
          auVar74._8_4_ = auVar118._8_4_ * auVar14._8_4_;
          auVar74._12_4_ = auVar118._12_4_ * auVar14._12_4_;
          auVar74._16_4_ = auVar118._16_4_ * 0.0;
          auVar74._20_4_ = auVar118._20_4_ * 0.0;
          auVar74._24_4_ = auVar118._24_4_ * 0.0;
          auVar74._28_4_ = local_400._28_4_;
          fVar141 = auVar111._0_4_;
          auVar187._0_4_ = auVar19._0_4_ * fVar141;
          fVar120 = auVar111._4_4_;
          auVar187._4_4_ = auVar19._4_4_ * fVar120;
          fVar121 = auVar111._8_4_;
          auVar187._8_4_ = auVar19._8_4_ * fVar121;
          fVar122 = auVar111._12_4_;
          auVar187._12_4_ = auVar19._12_4_ * fVar122;
          fVar123 = auVar111._16_4_;
          auVar187._16_4_ = fVar123 * 0.0;
          fVar124 = auVar111._20_4_;
          auVar187._20_4_ = fVar124 * 0.0;
          fVar125 = auVar111._24_4_;
          auVar187._28_36_ = auVar139._28_36_;
          auVar187._24_4_ = fVar125 * 0.0;
          auVar20 = vsubps_avx(auVar74,auVar187._0_32_);
          auVar44._4_4_ = local_e0._4_4_ * fVar76;
          auVar44._0_4_ = (float)local_e0 * fVar75;
          auVar44._8_4_ = (float)uStack_d8 * fVar77;
          auVar44._12_4_ = uStack_d8._4_4_ * fVar78;
          auVar44._16_4_ = (float)uStack_d0 * fVar79;
          auVar44._20_4_ = uStack_d0._4_4_ * fVar80;
          auVar44._24_4_ = (float)uStack_c8 * fVar81;
          auVar44._28_4_ = auVar139._28_4_;
          auVar210 = ZEXT3264(auVar174);
          auVar19 = vfmadd231ps_fma(auVar44,local_c0,auVar117);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,auVar8);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_80,auVar164);
          auVar45._4_4_ = local_e0._4_4_ * fVar140;
          auVar45._0_4_ = (float)local_e0 * fVar126;
          auVar45._8_4_ = (float)uStack_d8 * fVar82;
          auVar45._12_4_ = uStack_d8._4_4_ * fVar83;
          auVar45._16_4_ = (float)uStack_d0 * fVar84;
          auVar45._20_4_ = uStack_d0._4_4_ * fVar85;
          auVar45._24_4_ = (float)uStack_c8 * fVar86;
          auVar45._28_4_ = uStack_c8._4_4_;
          auVar14 = vfmadd231ps_fma(auVar45,auVar150,local_c0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar174,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar119,local_80);
          auVar211 = ZEXT1664(auVar14);
          auVar152 = ZEXT3264(auVar194._0_32_);
          auVar206._0_4_ = fVar141 * fVar141;
          auVar206._4_4_ = fVar120 * fVar120;
          auVar206._8_4_ = fVar121 * fVar121;
          auVar206._12_4_ = fVar122 * fVar122;
          auVar206._16_4_ = fVar123 * fVar123;
          auVar206._20_4_ = fVar124 * fVar124;
          auVar206._28_36_ = auVar194._28_36_;
          auVar206._24_4_ = fVar125 * fVar125;
          auVar15 = vfmadd231ps_fma(auVar206._0_32_,auVar118,auVar118);
          auVar137 = ZEXT1632(auVar19);
          auVar132 = ZEXT1632(auVar14);
          auVar13 = vmaxps_avx(auVar137,auVar132);
          auVar191._0_4_ = auVar13._0_4_ * auVar13._0_4_ * auVar15._0_4_;
          auVar191._4_4_ = auVar13._4_4_ * auVar13._4_4_ * auVar15._4_4_;
          auVar191._8_4_ = auVar13._8_4_ * auVar13._8_4_ * auVar15._8_4_;
          auVar191._12_4_ = auVar13._12_4_ * auVar13._12_4_ * auVar15._12_4_;
          auVar191._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
          auVar191._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
          auVar191._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
          auVar191._28_4_ = 0;
          auVar46._4_4_ = auVar20._4_4_ * auVar20._4_4_;
          auVar46._0_4_ = auVar20._0_4_ * auVar20._0_4_;
          auVar46._8_4_ = auVar20._8_4_ * auVar20._8_4_;
          auVar46._12_4_ = auVar20._12_4_ * auVar20._12_4_;
          auVar46._16_4_ = auVar20._16_4_ * auVar20._16_4_;
          auVar46._20_4_ = auVar20._20_4_ * auVar20._20_4_;
          auVar46._24_4_ = auVar20._24_4_ * auVar20._24_4_;
          auVar46._28_4_ = auVar20._28_4_;
          auVar13 = vcmpps_avx(auVar46,auVar191,2);
          local_2c0 = (int)lVar99;
          auVar192._4_4_ = local_2c0;
          auVar192._0_4_ = local_2c0;
          auVar192._8_4_ = local_2c0;
          auVar192._12_4_ = local_2c0;
          auVar192._16_4_ = local_2c0;
          auVar192._20_4_ = local_2c0;
          auVar192._24_4_ = local_2c0;
          auVar192._28_4_ = local_2c0;
          auVar20 = vpor_avx2(auVar192,_DAT_0205a920);
          auVar21 = vpcmpgtd_avx2(local_360,auVar20);
          auVar20 = auVar21 & auVar13;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0x7f,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar20 >> 0xbf,0) == '\0') &&
              (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar20[0x1f]) {
            auVar139 = ZEXT3264(local_620);
            auVar158 = ZEXT3264(local_600);
            auVar183 = ZEXT3264(auVar110);
            auVar179 = ZEXT3264(CONCAT428(fStack_544,
                                          CONCAT424(fStack_548,
                                                    CONCAT420(fStack_54c,
                                                              CONCAT416(fStack_550,
                                                                        CONCAT412(fStack_554,
                                                                                  CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
            auVar194 = ZEXT3264(auVar194._0_32_);
            auVar206 = ZEXT3264(local_6c0);
            auVar217 = ZEXT3264(local_700);
            uVar98 = uVar95 & 0xffffffff;
            auVar187 = ZEXT3264(local_6e0);
          }
          else {
            local_380 = vandps_avx(auVar21,auVar13);
            local_420._0_4_ = auVar93._0_4_;
            local_420._4_4_ = auVar93._4_4_;
            fStack_418 = auVar93._8_4_;
            fStack_414 = auVar93._12_4_;
            fStack_410 = auVar93._16_4_;
            fStack_40c = auVar93._20_4_;
            fStack_408 = auVar93._24_4_;
            auVar47._4_4_ = (float)local_5e0._4_4_ * (float)local_420._4_4_;
            auVar47._0_4_ = (float)local_5e0._0_4_ * (float)local_420._0_4_;
            auVar47._8_4_ = fStack_5d8 * fStack_418;
            auVar47._12_4_ = fStack_5d4 * fStack_414;
            auVar47._16_4_ = fStack_5d0 * fStack_410;
            auVar47._20_4_ = fStack_5cc * fStack_40c;
            auVar47._24_4_ = fStack_5c8 * fStack_408;
            auVar47._28_4_ = auVar13._28_4_;
            local_120 = auVar118;
            auVar19 = vfmadd213ps_fma(auVar150,local_3e0,auVar47);
            local_440 = auVar137;
            auVar19 = vfmadd213ps_fma(auVar174,local_100,ZEXT1632(auVar19));
            auVar19 = vfmadd213ps_fma(auVar119,local_460,ZEXT1632(auVar19));
            _local_420 = ZEXT1632(auVar19);
            local_500._0_4_ = auVar92._0_4_;
            local_500._4_4_ = auVar92._4_4_;
            fStack_4f8 = auVar92._8_4_;
            fStack_4f4 = auVar92._12_4_;
            auStack_4f0._0_4_ = auVar92._16_4_;
            auStack_4f0._4_4_ = auVar92._20_4_;
            fStack_4e8 = auVar92._24_4_;
            auVar48._4_4_ = (float)local_5e0._4_4_ * (float)local_500._4_4_;
            auVar48._0_4_ = (float)local_5e0._0_4_ * (float)local_500._0_4_;
            auVar48._8_4_ = fStack_5d8 * fStack_4f8;
            auVar48._12_4_ = fStack_5d4 * fStack_4f4;
            auVar48._16_4_ = fStack_5d0 * (float)auStack_4f0._0_4_;
            auVar48._20_4_ = fStack_5cc * (float)auStack_4f0._4_4_;
            auVar48._24_4_ = fStack_5c8 * fStack_4e8;
            auVar48._28_4_ = auVar13._28_4_;
            auVar19 = vfmadd213ps_fma(auVar117,local_3e0,auVar48);
            auVar19 = vfmadd213ps_fma(auVar8,local_100,ZEXT1632(auVar19));
            auVar8 = *(undefined1 (*) [32])(lVar22 + 0x22284f4 + lVar99 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar22 + 0x2228978 + lVar99 * 4);
            auVar174 = *(undefined1 (*) [32])(lVar22 + 0x2228dfc + lVar99 * 4);
            pfVar4 = (float *)(lVar22 + 0x2229280 + lVar99 * 4);
            fVar141 = *pfVar4;
            fVar120 = pfVar4[1];
            fVar121 = pfVar4[2];
            fVar122 = pfVar4[3];
            fVar123 = pfVar4[4];
            fVar124 = pfVar4[5];
            fVar125 = pfVar4[6];
            auVar49._4_4_ = fVar120 * fStack_55c;
            auVar49._0_4_ = fVar141 * local_560;
            auVar49._8_4_ = fVar121 * fStack_558;
            auVar49._12_4_ = fVar122 * fStack_554;
            auVar49._16_4_ = fVar123 * fStack_550;
            auVar49._20_4_ = fVar124 * fStack_54c;
            auVar49._24_4_ = fVar125 * fStack_548;
            auVar49._28_4_ = auVar119._28_4_;
            auVar208._0_4_ = fVar141 * fVar188;
            auVar208._4_4_ = fVar120 * fVar195;
            auVar208._8_4_ = fVar121 * fVar196;
            auVar208._12_4_ = fVar122 * fVar197;
            auVar208._16_4_ = fVar123 * fVar198;
            auVar208._20_4_ = fVar124 * fVar199;
            auVar208._24_4_ = fVar125 * fVar200;
            auVar208._28_4_ = 0;
            auVar50._4_4_ = fVar120 * (float)local_5e0._4_4_;
            auVar50._0_4_ = fVar141 * (float)local_5e0._0_4_;
            auVar50._8_4_ = fVar121 * fStack_5d8;
            auVar50._12_4_ = fVar122 * fStack_5d4;
            auVar50._16_4_ = fVar123 * fStack_5d0;
            auVar50._20_4_ = fVar124 * fStack_5cc;
            auVar50._24_4_ = fVar125 * fStack_5c8;
            auVar50._28_4_ = pfVar4[7];
            auVar15 = vfmadd231ps_fma(auVar49,auVar174,local_600);
            auVar16 = vfmadd231ps_fma(auVar208,auVar174,auVar110);
            auVar17 = vfmadd231ps_fma(auVar50,local_3e0,auVar174);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar117,local_6c0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar117,local_620);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_100,auVar117);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar8,local_700);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar8,local_400);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_460,auVar8);
            pfVar4 = (float *)(lVar22 + 0x222b6a0 + lVar99 * 4);
            fVar141 = *pfVar4;
            fVar120 = pfVar4[1];
            fVar121 = pfVar4[2];
            fVar122 = pfVar4[3];
            fVar123 = pfVar4[4];
            fVar124 = pfVar4[5];
            fVar125 = pfVar4[6];
            auVar51._4_4_ = fStack_55c * fVar120;
            auVar51._0_4_ = local_560 * fVar141;
            auVar51._8_4_ = fStack_558 * fVar121;
            auVar51._12_4_ = fStack_554 * fVar122;
            auVar51._16_4_ = fStack_550 * fVar123;
            auVar51._20_4_ = fStack_54c * fVar124;
            auVar51._24_4_ = fStack_548 * fVar125;
            auVar51._28_4_ = local_460._28_4_;
            auVar52._4_4_ = fVar195 * fVar120;
            auVar52._0_4_ = fVar188 * fVar141;
            auVar52._8_4_ = fVar196 * fVar121;
            auVar52._12_4_ = fVar197 * fVar122;
            auVar52._16_4_ = fVar198 * fVar123;
            auVar52._20_4_ = fVar199 * fVar124;
            auVar52._24_4_ = fVar200 * fVar125;
            auVar52._28_4_ = auVar111._28_4_;
            auVar53._4_4_ = fVar120 * (float)local_5e0._4_4_;
            auVar53._0_4_ = fVar141 * (float)local_5e0._0_4_;
            auVar53._8_4_ = fVar121 * fStack_5d8;
            auVar53._12_4_ = fVar122 * fStack_5d4;
            auVar53._16_4_ = fVar123 * fStack_5d0;
            auVar53._20_4_ = fVar124 * fStack_5cc;
            auVar53._24_4_ = fVar125 * fStack_5c8;
            auVar53._28_4_ = pfVar4[7];
            auVar8 = *(undefined1 (*) [32])(lVar22 + 0x222b21c + lVar99 * 4);
            auVar18 = vfmadd231ps_fma(auVar51,auVar8,local_600);
            auVar108 = vfmadd231ps_fma(auVar52,auVar8,local_640);
            auVar107 = vfmadd231ps_fma(auVar53,local_3e0,auVar8);
            auVar8 = *(undefined1 (*) [32])(lVar22 + 0x222ad98 + lVar99 * 4);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar8,local_6c0);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar8,local_620);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_100,auVar8);
            auVar8 = *(undefined1 (*) [32])(lVar22 + 0x222a914 + lVar99 * 4);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar8,local_700);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar8,local_400);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_460,auVar8);
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
            auVar193._16_4_ = 0x7fffffff;
            auVar193._20_4_ = 0x7fffffff;
            auVar193._24_4_ = 0x7fffffff;
            auVar193._28_4_ = 0x7fffffff;
            auVar8 = vandps_avx(ZEXT1632(auVar15),auVar193);
            auVar117 = vandps_avx(ZEXT1632(auVar16),auVar193);
            auVar117 = vmaxps_avx(auVar8,auVar117);
            auVar8 = vandps_avx(ZEXT1632(auVar17),auVar193);
            auVar8 = vmaxps_avx(auVar117,auVar8);
            auVar91._4_4_ = uStack_13c;
            auVar91._0_4_ = local_140;
            auVar91._8_4_ = uStack_138;
            auVar91._12_4_ = uStack_134;
            auVar91._16_4_ = uStack_130;
            auVar91._20_4_ = uStack_12c;
            auVar91._24_4_ = uStack_128;
            auVar91._28_4_ = uStack_124;
            auVar8 = vcmpps_avx(auVar8,auVar91,1);
            auVar119 = vblendvps_avx(ZEXT1632(auVar15),auVar118,auVar8);
            auVar174 = vblendvps_avx(ZEXT1632(auVar16),auVar111,auVar8);
            auVar8 = vandps_avx(ZEXT1632(auVar18),auVar193);
            auVar117 = vandps_avx(ZEXT1632(auVar108),auVar193);
            auVar117 = vmaxps_avx(auVar8,auVar117);
            auVar8 = vandps_avx(auVar193,ZEXT1632(auVar107));
            auVar8 = vmaxps_avx(auVar117,auVar8);
            auVar117 = vcmpps_avx(auVar8,auVar91,1);
            auVar8 = vblendvps_avx(ZEXT1632(auVar18),auVar118,auVar117);
            auVar117 = vblendvps_avx(ZEXT1632(auVar108),auVar111,auVar117);
            auVar19 = vfmadd213ps_fma(auVar164,local_460,ZEXT1632(auVar19));
            auVar15 = vfmadd213ps_fma(auVar119,auVar119,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar174,auVar174);
            auVar164 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar141 = auVar164._0_4_;
            fVar120 = auVar164._4_4_;
            fVar121 = auVar164._8_4_;
            fVar122 = auVar164._12_4_;
            fVar123 = auVar164._16_4_;
            fVar124 = auVar164._20_4_;
            fVar125 = auVar164._24_4_;
            auVar54._4_4_ = fVar120 * fVar120 * fVar120 * auVar15._4_4_ * -0.5;
            auVar54._0_4_ = fVar141 * fVar141 * fVar141 * auVar15._0_4_ * -0.5;
            auVar54._8_4_ = fVar121 * fVar121 * fVar121 * auVar15._8_4_ * -0.5;
            auVar54._12_4_ = fVar122 * fVar122 * fVar122 * auVar15._12_4_ * -0.5;
            auVar54._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar54._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar54._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
            auVar54._28_4_ = 0;
            auVar216._8_4_ = 0x3fc00000;
            auVar216._0_8_ = 0x3fc000003fc00000;
            auVar216._12_4_ = 0x3fc00000;
            auVar216._16_4_ = 0x3fc00000;
            auVar216._20_4_ = 0x3fc00000;
            auVar216._24_4_ = 0x3fc00000;
            auVar216._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar54,auVar216,auVar164);
            fVar141 = auVar15._0_4_;
            fVar120 = auVar15._4_4_;
            auVar55._4_4_ = auVar174._4_4_ * fVar120;
            auVar55._0_4_ = auVar174._0_4_ * fVar141;
            fVar121 = auVar15._8_4_;
            auVar55._8_4_ = auVar174._8_4_ * fVar121;
            fVar122 = auVar15._12_4_;
            auVar55._12_4_ = auVar174._12_4_ * fVar122;
            auVar55._16_4_ = auVar174._16_4_ * 0.0;
            auVar55._20_4_ = auVar174._20_4_ * 0.0;
            auVar55._24_4_ = auVar174._24_4_ * 0.0;
            auVar55._28_4_ = auVar164._28_4_;
            auVar56._4_4_ = fVar120 * -auVar119._4_4_;
            auVar56._0_4_ = fVar141 * -auVar119._0_4_;
            auVar56._8_4_ = fVar121 * -auVar119._8_4_;
            auVar56._12_4_ = fVar122 * -auVar119._12_4_;
            auVar56._16_4_ = -auVar119._16_4_ * 0.0;
            auVar56._20_4_ = -auVar119._20_4_ * 0.0;
            auVar56._24_4_ = -auVar119._24_4_ * 0.0;
            auVar56._28_4_ = auVar174._28_4_;
            auVar15 = vfmadd213ps_fma(auVar8,auVar8,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar117,auVar117);
            auVar164 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar57._28_4_ = local_460._28_4_;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar122 * 0.0,
                                    CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
            fVar141 = auVar164._0_4_;
            fVar120 = auVar164._4_4_;
            fVar121 = auVar164._8_4_;
            fVar122 = auVar164._12_4_;
            fVar123 = auVar164._16_4_;
            fVar124 = auVar164._20_4_;
            fVar125 = auVar164._24_4_;
            auVar58._4_4_ = fVar120 * fVar120 * fVar120 * auVar15._4_4_ * -0.5;
            auVar58._0_4_ = fVar141 * fVar141 * fVar141 * auVar15._0_4_ * -0.5;
            auVar58._8_4_ = fVar121 * fVar121 * fVar121 * auVar15._8_4_ * -0.5;
            auVar58._12_4_ = fVar122 * fVar122 * fVar122 * auVar15._12_4_ * -0.5;
            auVar58._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar58._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar58._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
            auVar58._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar58,auVar216,auVar164);
            fVar141 = auVar15._0_4_;
            fVar120 = auVar15._4_4_;
            auVar59._4_4_ = auVar117._4_4_ * fVar120;
            auVar59._0_4_ = auVar117._0_4_ * fVar141;
            fVar121 = auVar15._8_4_;
            auVar59._8_4_ = auVar117._8_4_ * fVar121;
            fVar122 = auVar15._12_4_;
            auVar59._12_4_ = auVar117._12_4_ * fVar122;
            auVar59._16_4_ = auVar117._16_4_ * 0.0;
            auVar59._20_4_ = auVar117._20_4_ * 0.0;
            auVar59._24_4_ = auVar117._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = fVar120 * -auVar8._4_4_;
            auVar60._0_4_ = fVar141 * -auVar8._0_4_;
            auVar60._8_4_ = fVar121 * -auVar8._8_4_;
            auVar60._12_4_ = fVar122 * -auVar8._12_4_;
            auVar60._16_4_ = -auVar8._16_4_ * 0.0;
            auVar60._20_4_ = -auVar8._20_4_ * 0.0;
            auVar60._24_4_ = -auVar8._24_4_ * 0.0;
            auVar60._28_4_ = auVar164._28_4_;
            auVar61._28_4_ = 0xbf000000;
            auVar61._0_28_ =
                 ZEXT1628(CONCAT412(fVar122 * 0.0,
                                    CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar55,auVar137,auVar131);
            auVar16 = vfmadd213ps_fma(auVar56,auVar137,local_580);
            auVar17 = vfmadd213ps_fma(auVar57,auVar137,ZEXT1632(auVar19));
            auVar129 = vfnmadd213ps_fma(auVar55,auVar137,auVar131);
            auVar18 = vfmadd213ps_fma(auVar59,auVar132,auVar112);
            auVar106 = vfnmadd213ps_fma(auVar56,auVar137,local_580);
            auVar108 = vfmadd213ps_fma(auVar60,auVar132,auVar177);
            auVar19 = vfnmadd231ps_fma(ZEXT1632(auVar19),auVar137,auVar57);
            auVar107 = vfmadd213ps_fma(auVar61,auVar132,_local_420);
            auVar130 = vfnmadd213ps_fma(auVar59,auVar132,auVar112);
            auVar153 = vfnmadd213ps_fma(auVar60,auVar132,auVar177);
            auVar160 = vfnmadd231ps_fma(_local_420,auVar132,auVar61);
            auVar164 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar106));
            auVar8 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar19));
            auVar62._4_4_ = auVar164._4_4_ * auVar19._4_4_;
            auVar62._0_4_ = auVar164._0_4_ * auVar19._0_4_;
            auVar62._8_4_ = auVar164._8_4_ * auVar19._8_4_;
            auVar62._12_4_ = auVar164._12_4_ * auVar19._12_4_;
            auVar62._16_4_ = auVar164._16_4_ * 0.0;
            auVar62._20_4_ = auVar164._20_4_ * 0.0;
            auVar62._24_4_ = auVar164._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar142 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar106),auVar8);
            auVar63._4_4_ = auVar129._4_4_ * auVar8._4_4_;
            auVar63._0_4_ = auVar129._0_4_ * auVar8._0_4_;
            auVar63._8_4_ = auVar129._8_4_ * auVar8._8_4_;
            auVar63._12_4_ = auVar129._12_4_ * auVar8._12_4_;
            auVar63._16_4_ = auVar8._16_4_ * 0.0;
            auVar63._20_4_ = auVar8._20_4_ * 0.0;
            auVar63._24_4_ = auVar8._24_4_ * 0.0;
            auVar63._28_4_ = auVar8._28_4_;
            auVar150 = ZEXT1632(auVar129);
            auVar8 = vsubps_avx(ZEXT1632(auVar18),auVar150);
            auVar118 = ZEXT1632(auVar19);
            auVar19 = vfmsub231ps_fma(auVar63,auVar118,auVar8);
            auVar64._4_4_ = auVar106._4_4_ * auVar8._4_4_;
            auVar64._0_4_ = auVar106._0_4_ * auVar8._0_4_;
            auVar64._8_4_ = auVar106._8_4_ * auVar8._8_4_;
            auVar64._12_4_ = auVar106._12_4_ * auVar8._12_4_;
            auVar64._16_4_ = auVar8._16_4_ * 0.0;
            auVar64._20_4_ = auVar8._20_4_ * 0.0;
            auVar64._24_4_ = auVar8._24_4_ * 0.0;
            auVar64._28_4_ = auVar8._28_4_;
            auVar129 = vfmsub231ps_fma(auVar64,auVar150,auVar164);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar142));
            auVar111 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,2);
            local_580 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar15),auVar111);
            auVar164 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar16),auVar111);
            auVar8 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar17),auVar111);
            auVar117 = vblendvps_avx(auVar150,ZEXT1632(auVar18),auVar111);
            auVar119 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar108),auVar111);
            auVar174 = vblendvps_avx(auVar118,ZEXT1632(auVar107),auVar111);
            auVar150 = vblendvps_avx(ZEXT1632(auVar18),auVar150,auVar111);
            auVar13 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar106),auVar111);
            auVar19 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
            auVar118 = vblendvps_avx(ZEXT1632(auVar107),auVar118,auVar111);
            auVar150 = vsubps_avx(auVar150,local_580);
            auVar13 = vsubps_avx(auVar13,auVar164);
            auVar20 = vsubps_avx(auVar118,auVar8);
            auVar210 = ZEXT3264(auVar20);
            auVar21 = vsubps_avx(local_580,auVar117);
            auVar177 = vsubps_avx(auVar164,auVar119);
            auVar110 = vsubps_avx(auVar8,auVar174);
            auVar171._0_4_ = auVar20._0_4_ * local_580._0_4_;
            auVar171._4_4_ = auVar20._4_4_ * local_580._4_4_;
            auVar171._8_4_ = auVar20._8_4_ * local_580._8_4_;
            auVar171._12_4_ = auVar20._12_4_ * local_580._12_4_;
            auVar171._16_4_ = auVar20._16_4_ * local_580._16_4_;
            auVar171._20_4_ = auVar20._20_4_ * local_580._20_4_;
            auVar171._24_4_ = auVar20._24_4_ * local_580._24_4_;
            auVar171._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar171,auVar8,auVar150);
            auVar65._4_4_ = auVar150._4_4_ * auVar164._4_4_;
            auVar65._0_4_ = auVar150._0_4_ * auVar164._0_4_;
            auVar65._8_4_ = auVar150._8_4_ * auVar164._8_4_;
            auVar65._12_4_ = auVar150._12_4_ * auVar164._12_4_;
            auVar65._16_4_ = auVar150._16_4_ * auVar164._16_4_;
            auVar65._20_4_ = auVar150._20_4_ * auVar164._20_4_;
            auVar65._24_4_ = auVar150._24_4_ * auVar164._24_4_;
            auVar65._28_4_ = auVar118._28_4_;
            auVar16 = vfmsub231ps_fma(auVar65,local_580,auVar13);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar172._0_4_ = auVar13._0_4_ * auVar8._0_4_;
            auVar172._4_4_ = auVar13._4_4_ * auVar8._4_4_;
            auVar172._8_4_ = auVar13._8_4_ * auVar8._8_4_;
            auVar172._12_4_ = auVar13._12_4_ * auVar8._12_4_;
            auVar172._16_4_ = auVar13._16_4_ * auVar8._16_4_;
            auVar172._20_4_ = auVar13._20_4_ * auVar8._20_4_;
            auVar172._24_4_ = auVar13._24_4_ * auVar8._24_4_;
            auVar172._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar172,auVar164,auVar20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar152 = ZEXT1664(auVar16);
            auVar173._0_4_ = auVar110._0_4_ * auVar117._0_4_;
            auVar173._4_4_ = auVar110._4_4_ * auVar117._4_4_;
            auVar173._8_4_ = auVar110._8_4_ * auVar117._8_4_;
            auVar173._12_4_ = auVar110._12_4_ * auVar117._12_4_;
            auVar173._16_4_ = auVar110._16_4_ * auVar117._16_4_;
            auVar173._20_4_ = auVar110._20_4_ * auVar117._20_4_;
            auVar173._24_4_ = auVar110._24_4_ * auVar117._24_4_;
            auVar173._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar173,auVar21,auVar174);
            auVar66._4_4_ = auVar177._4_4_ * auVar174._4_4_;
            auVar66._0_4_ = auVar177._0_4_ * auVar174._0_4_;
            auVar66._8_4_ = auVar177._8_4_ * auVar174._8_4_;
            auVar66._12_4_ = auVar177._12_4_ * auVar174._12_4_;
            auVar66._16_4_ = auVar177._16_4_ * auVar174._16_4_;
            auVar66._20_4_ = auVar177._20_4_ * auVar174._20_4_;
            auVar66._24_4_ = auVar177._24_4_ * auVar174._24_4_;
            auVar66._28_4_ = local_580._28_4_;
            auVar17 = vfmsub231ps_fma(auVar66,auVar119,auVar110);
            auVar67._4_4_ = auVar21._4_4_ * auVar119._4_4_;
            auVar67._0_4_ = auVar21._0_4_ * auVar119._0_4_;
            auVar67._8_4_ = auVar21._8_4_ * auVar119._8_4_;
            auVar67._12_4_ = auVar21._12_4_ * auVar119._12_4_;
            auVar67._16_4_ = auVar21._16_4_ * auVar119._16_4_;
            auVar67._20_4_ = auVar21._20_4_ * auVar119._20_4_;
            auVar67._24_4_ = auVar21._24_4_ * auVar119._24_4_;
            auVar67._28_4_ = auVar119._28_4_;
            auVar18 = vfmsub231ps_fma(auVar67,auVar177,auVar117);
            auVar119 = ZEXT832(0) << 0x20;
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar119,ZEXT1632(auVar15));
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,ZEXT1632(auVar17));
            auVar117 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
            auVar117 = vcmpps_avx(auVar117,auVar119,2);
            auVar15 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
            auVar15 = vpand_avx(auVar15,auVar19);
            auVar117 = vpmovsxwd_avx2(auVar15);
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar117 >> 0x7f,0) == '\0') &&
                  (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0xbf,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar117[0x1f]) {
LAB_016470c1:
              auVar157._8_8_ = uStack_478;
              auVar157._0_8_ = local_480;
              auVar157._16_8_ = uStack_470;
              auVar157._24_8_ = uStack_468;
            }
            else {
              auVar68._4_4_ = auVar13._4_4_ * auVar110._4_4_;
              auVar68._0_4_ = auVar13._0_4_ * auVar110._0_4_;
              auVar68._8_4_ = auVar13._8_4_ * auVar110._8_4_;
              auVar68._12_4_ = auVar13._12_4_ * auVar110._12_4_;
              auVar68._16_4_ = auVar13._16_4_ * auVar110._16_4_;
              auVar68._20_4_ = auVar13._20_4_ * auVar110._20_4_;
              auVar68._24_4_ = auVar13._24_4_ * auVar110._24_4_;
              auVar68._28_4_ = auVar117._28_4_;
              auVar142 = vfmsub231ps_fma(auVar68,auVar177,auVar20);
              auVar178._0_4_ = auVar20._0_4_ * auVar21._0_4_;
              auVar178._4_4_ = auVar20._4_4_ * auVar21._4_4_;
              auVar178._8_4_ = auVar20._8_4_ * auVar21._8_4_;
              auVar178._12_4_ = auVar20._12_4_ * auVar21._12_4_;
              auVar178._16_4_ = auVar20._16_4_ * auVar21._16_4_;
              auVar178._20_4_ = auVar20._20_4_ * auVar21._20_4_;
              auVar178._24_4_ = auVar20._24_4_ * auVar21._24_4_;
              auVar178._28_4_ = 0;
              auVar107 = vfmsub231ps_fma(auVar178,auVar150,auVar110);
              auVar69._4_4_ = auVar150._4_4_ * auVar177._4_4_;
              auVar69._0_4_ = auVar150._0_4_ * auVar177._0_4_;
              auVar69._8_4_ = auVar150._8_4_ * auVar177._8_4_;
              auVar69._12_4_ = auVar150._12_4_ * auVar177._12_4_;
              auVar69._16_4_ = auVar150._16_4_ * auVar177._16_4_;
              auVar69._20_4_ = auVar150._20_4_ * auVar177._20_4_;
              auVar69._24_4_ = auVar150._24_4_ * auVar177._24_4_;
              auVar69._28_4_ = auVar177._28_4_;
              auVar129 = vfmsub231ps_fma(auVar69,auVar21,auVar13);
              auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar129));
              auVar108 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar142),auVar119);
              auVar117 = vrcpps_avx(ZEXT1632(auVar108));
              auVar209._8_4_ = 0x3f800000;
              auVar209._0_8_ = &DAT_3f8000003f800000;
              auVar209._12_4_ = 0x3f800000;
              auVar209._16_4_ = 0x3f800000;
              auVar209._20_4_ = 0x3f800000;
              auVar209._24_4_ = 0x3f800000;
              auVar209._28_4_ = 0x3f800000;
              auVar210 = ZEXT3264(auVar209);
              auVar18 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar108),auVar209);
              auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar117,auVar117);
              auVar70._4_4_ = auVar129._4_4_ * auVar8._4_4_;
              auVar70._0_4_ = auVar129._0_4_ * auVar8._0_4_;
              auVar70._8_4_ = auVar129._8_4_ * auVar8._8_4_;
              auVar70._12_4_ = auVar129._12_4_ * auVar8._12_4_;
              auVar70._16_4_ = auVar8._16_4_ * 0.0;
              auVar70._20_4_ = auVar8._20_4_ * 0.0;
              auVar70._24_4_ = auVar8._24_4_ * 0.0;
              auVar70._28_4_ = auVar164._28_4_;
              auVar107 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar107),auVar164);
              auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar142),local_580);
              fVar120 = auVar18._0_4_;
              fVar121 = auVar18._4_4_;
              fVar122 = auVar18._8_4_;
              fVar123 = auVar18._12_4_;
              auVar174 = ZEXT1632(CONCAT412(fVar123 * auVar107._12_4_,
                                            CONCAT48(fVar122 * auVar107._8_4_,
                                                     CONCAT44(fVar121 * auVar107._4_4_,
                                                              fVar120 * auVar107._0_4_))));
              fVar141 = local_7b0->tfar;
              auVar156._4_4_ = fVar141;
              auVar156._0_4_ = fVar141;
              auVar156._8_4_ = fVar141;
              auVar156._12_4_ = fVar141;
              auVar156._16_4_ = fVar141;
              auVar156._20_4_ = fVar141;
              auVar156._24_4_ = fVar141;
              auVar156._28_4_ = fVar141;
              auVar90._4_4_ = uStack_15c;
              auVar90._0_4_ = local_160;
              auVar90._8_4_ = uStack_158;
              auVar90._12_4_ = uStack_154;
              auVar90._16_4_ = uStack_150;
              auVar90._20_4_ = uStack_14c;
              auVar90._24_4_ = uStack_148;
              auVar90._28_4_ = uStack_144;
              auVar117 = vcmpps_avx(auVar90,auVar174,2);
              auVar119 = vcmpps_avx(auVar174,auVar156,2);
              auVar117 = vandps_avx(auVar119,auVar117);
              auVar18 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
              auVar15 = vpand_avx(auVar15,auVar18);
              auVar117 = vpmovsxwd_avx2(auVar15);
              if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar117 >> 0x7f,0) == '\0') &&
                    (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar117 >> 0xbf,0) == '\0') &&
                  (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar117[0x1f]) goto LAB_016470c1;
              auVar117 = vcmpps_avx(ZEXT1632(auVar108),ZEXT832(0) << 0x20,4);
              auVar18 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
              auVar15 = vpand_avx(auVar15,auVar18);
              auVar117 = vpmovsxwd_avx2(auVar15);
              auVar157._8_8_ = uStack_478;
              auVar157._0_8_ = local_480;
              auVar157._16_8_ = uStack_470;
              auVar157._24_8_ = uStack_468;
              if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar117 >> 0x7f,0) != '\0') ||
                    (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0xbf,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar117[0x1f] < '\0') {
                auVar150 = ZEXT1632(CONCAT412(fVar123 * auVar16._12_4_,
                                              CONCAT48(fVar122 * auVar16._8_4_,
                                                       CONCAT44(fVar121 * auVar16._4_4_,
                                                                fVar120 * auVar16._0_4_))));
                auVar71._28_4_ = SUB84(uStack_468,4);
                auVar71._0_28_ =
                     ZEXT1628(CONCAT412(fVar123 * auVar17._12_4_,
                                        CONCAT48(fVar122 * auVar17._8_4_,
                                                 CONCAT44(fVar121 * auVar17._4_4_,
                                                          fVar120 * auVar17._0_4_))));
                auVar186._8_4_ = 0x3f800000;
                auVar186._0_8_ = &DAT_3f8000003f800000;
                auVar186._12_4_ = 0x3f800000;
                auVar186._16_4_ = 0x3f800000;
                auVar186._20_4_ = 0x3f800000;
                auVar186._24_4_ = 0x3f800000;
                auVar186._28_4_ = 0x3f800000;
                auVar119 = vsubps_avx(auVar186,auVar150);
                _local_1c0 = vblendvps_avx(auVar119,auVar150,auVar111);
                auVar119 = vsubps_avx(auVar186,auVar71);
                local_3c0 = vblendvps_avx(auVar119,auVar71,auVar111);
                auVar152 = ZEXT3264(local_3c0);
                local_1e0 = auVar174;
                auVar157 = auVar117;
              }
            }
            auVar217 = ZEXT3264(local_700);
            auVar206 = ZEXT3264(local_6c0);
            auVar211 = ZEXT3264(auVar132);
            uVar98 = uVar95 & 0xffffffff;
            auVar89._4_4_ = fStack_53c;
            auVar89._0_4_ = local_540;
            auVar89._8_4_ = fStack_538;
            auVar89._12_4_ = fStack_534;
            auVar89._16_4_ = fStack_530;
            auVar89._20_4_ = fStack_52c;
            auVar89._24_4_ = fStack_528;
            auVar89._28_4_ = fStack_524;
            if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar157 >> 0x7f,0) == '\0') &&
                  (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar157 >> 0xbf,0) == '\0') &&
                (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar157[0x1f]) {
              auVar179 = ZEXT3264(CONCAT428(fStack_544,
                                            CONCAT424(fStack_548,
                                                      CONCAT420(fStack_54c,
                                                                CONCAT416(fStack_550,
                                                                          CONCAT412(fStack_554,
                                                                                    CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
            }
            else {
              auVar117 = vsubps_avx(auVar132,auVar137);
              auVar15 = vfmadd213ps_fma(auVar117,_local_1c0,auVar137);
              fVar141 = pre->depth_scale;
              auVar72._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar141;
              auVar72._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar141;
              auVar72._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar141;
              auVar72._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar141;
              auVar72._16_4_ = fVar141 * 0.0;
              auVar72._20_4_ = fVar141 * 0.0;
              auVar72._24_4_ = fVar141 * 0.0;
              auVar72._28_4_ = fVar141;
              auVar117 = vcmpps_avx(local_1e0,auVar72,6);
              auVar119 = auVar157 & auVar117;
              auVar179 = ZEXT3264(CONCAT428(fStack_544,
                                            CONCAT424(fStack_548,
                                                      CONCAT420(fStack_54c,
                                                                CONCAT416(fStack_550,
                                                                          CONCAT412(fStack_554,
                                                                                    CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
              auVar183 = ZEXT3264(local_640);
              if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar119 >> 0x7f,0) != '\0') ||
                    (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar119 >> 0xbf,0) != '\0') ||
                  (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar119[0x1f] < '\0') {
                local_260 = vandps_avx(auVar117,auVar157);
                auVar138._8_4_ = 0xbf800000;
                auVar138._0_8_ = 0xbf800000bf800000;
                auVar138._12_4_ = 0xbf800000;
                auVar138._16_4_ = 0xbf800000;
                auVar138._20_4_ = 0xbf800000;
                auVar138._24_4_ = 0xbf800000;
                auVar138._28_4_ = 0xbf800000;
                auVar151._8_4_ = 0x40000000;
                auVar151._0_8_ = 0x4000000040000000;
                auVar151._12_4_ = 0x40000000;
                auVar151._16_4_ = 0x40000000;
                auVar151._20_4_ = 0x40000000;
                auVar151._24_4_ = 0x40000000;
                auVar151._28_4_ = 0x40000000;
                auVar152 = ZEXT3264(auVar151);
                auVar15 = vfmadd213ps_fma(local_3c0,auVar151,auVar138);
                local_320 = _local_1c0;
                local_300 = ZEXT1632(auVar15);
                local_2e0 = local_1e0;
                local_2bc = iVar10;
                local_2b0 = local_6a0;
                uStack_2a8 = uStack_698;
                local_2a0 = local_490._0_8_;
                uStack_298 = local_490._8_8_;
                local_290 = local_4a0._0_8_;
                uStack_288 = local_4a0._8_8_;
                local_280 = local_4b0;
                pGVar11 = (local_7b8->scene->geometries).items[local_728].ptr;
                local_780 = ZEXT1632(CONCAT88(auVar19._8_8_,pGVar11));
                auVar194 = ZEXT3264(auVar89);
                local_3c0 = ZEXT1632(auVar15);
                auVar117 = local_3c0;
                if ((pGVar11->mask & local_7b0->mask) == 0) {
                  bVar94 = 0;
                  auVar139 = ZEXT3264(local_620);
                  uVar98 = uVar95 & 0xffffffff;
                  auVar187 = ZEXT3264(local_6e0);
                }
                else {
                  auVar139 = ZEXT3264(local_620);
                  uVar98 = uVar95 & 0xffffffff;
                  if (local_7b8->args->filter == (RTCFilterFunctionN)0x0) {
                    auVar187 = ZEXT3264(local_6e0);
                    bVar94 = 1;
                    if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_0164704e;
                  }
                  auVar210 = ZEXT1264(ZEXT812(0));
                  fVar141 = (float)local_2c0;
                  auVar152 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar141,CONCAT420(fVar141,
                                                  CONCAT416(fVar141,CONCAT412(fVar141,CONCAT48(
                                                  fVar141,CONCAT44(fVar141,fVar141))))))));
                  local_240[0] = (fVar141 + (float)local_1c0._0_4_ + 0.0) * local_180;
                  local_240[1] = (fVar141 + (float)local_1c0._4_4_ + 1.0) * fStack_17c;
                  local_240[2] = (fVar141 + fStack_1b8 + 2.0) * fStack_178;
                  local_240[3] = (fVar141 + fStack_1b4 + 3.0) * fStack_174;
                  fStack_230 = (fVar141 + fStack_1b0 + 4.0) * fStack_170;
                  fStack_22c = (fVar141 + fStack_1ac + 5.0) * fStack_16c;
                  fStack_228 = (fVar141 + fStack_1a8 + 6.0) * fStack_168;
                  fStack_224 = fVar141 + fStack_1a4 + 7.0;
                  local_3c0._0_8_ = auVar15._0_8_;
                  local_3c0._8_8_ = auVar15._8_8_;
                  local_220 = local_3c0._0_8_;
                  uStack_218 = local_3c0._8_8_;
                  uStack_210 = 0;
                  uStack_208 = 0;
                  local_200 = local_1e0;
                  uVar96 = vmovmskps_avx(local_260);
                  local_660._1_3_ = (int3)(uVar95 >> 8);
                  local_660[0] = uVar96 != 0;
                  local_660._4_28_ = auVar8._4_28_;
                  local_3c0 = auVar117;
                  if (uVar96 != 0) {
                    uVar98 = (ulong)(uVar96 & 0xff);
                    local_760 = ZEXT1632(CONCAT88(auVar14._8_8_,uVar98));
                    local_7a0 = (undefined1  [8])0x0;
                    for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                      local_7a0 = (undefined1  [8])((long)local_7a0 + 1);
                    }
                    _auStack_798 = auVar164._8_24_;
                    local_4e0 = ZEXT1632(local_490);
                    _auStack_4f0 = SUB3216(*pauVar2,0x10);
                    _local_500 = local_4a0;
                    _local_520 = ZEXT1632(local_4b0);
                    do {
                      local_5a4 = local_240[(long)local_7a0];
                      local_5a0 = *(undefined4 *)((long)&local_220 + (long)local_7a0 * 4);
                      local_580._0_4_ = local_7b0->tfar;
                      local_7b0->tfar = *(float *)(local_200 + (long)local_7a0 * 4);
                      local_690.context = local_7b8->user;
                      fVar120 = 1.0 - local_5a4;
                      fVar141 = fVar120 * fVar120 * -3.0;
                      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar120 * fVar120)),
                                                ZEXT416((uint)(local_5a4 * fVar120)),
                                                ZEXT416(0xc0000000));
                      auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar120)),
                                                ZEXT416((uint)(local_5a4 * local_5a4)),
                                                ZEXT416(0x40000000));
                      fVar120 = auVar19._0_4_ * 3.0;
                      fVar121 = auVar14._0_4_ * 3.0;
                      fVar122 = local_5a4 * local_5a4 * 3.0;
                      auVar169._0_4_ = fVar122 * (float)local_520._0_4_;
                      auVar169._4_4_ = fVar122 * (float)local_520._4_4_;
                      auVar169._8_4_ = fVar122 * fStack_518;
                      auVar169._12_4_ = fVar122 * fStack_514;
                      auVar145._4_4_ = fVar121;
                      auVar145._0_4_ = fVar121;
                      auVar145._8_4_ = fVar121;
                      auVar145._12_4_ = fVar121;
                      auVar19 = vfmadd132ps_fma(auVar145,auVar169,_local_500);
                      auVar155._4_4_ = fVar120;
                      auVar155._0_4_ = fVar120;
                      auVar155._8_4_ = fVar120;
                      auVar155._12_4_ = fVar120;
                      auVar19 = vfmadd132ps_fma(auVar155,auVar19,local_4e0._0_16_);
                      auVar146._4_4_ = fVar141;
                      auVar146._0_4_ = fVar141;
                      auVar146._8_4_ = fVar141;
                      auVar146._12_4_ = fVar141;
                      auVar88._8_8_ = uStack_698;
                      auVar88._0_8_ = local_6a0;
                      auVar19 = vfmadd132ps_fma(auVar146,auVar19,auVar88);
                      auVar152 = ZEXT1664(auVar19);
                      local_5b0 = vmovlps_avx(auVar19);
                      local_5a8 = vextractps_avx(auVar19,2);
                      local_59c = local_7a4;
                      local_598 = (int)local_728;
                      local_594 = (local_690.context)->instID[0];
                      local_590 = (local_690.context)->instPrimID[0];
                      local_7bc = -1;
                      local_690.valid = &local_7bc;
                      local_690.geometryUserPtr = *(void **)(local_780._0_8_ + 0x18);
                      local_690.ray = (RTCRayN *)local_7b0;
                      local_690.hit = (RTCHitN *)&local_5b0;
                      local_690.N = 1;
                      if (*(code **)(local_780._0_8_ + 0x48) == (code *)0x0) {
LAB_01646f3d:
                        p_Var12 = local_7b8->args->filter;
                        if (p_Var12 == (RTCFilterFunctionN)0x0) break;
                        if (((local_7b8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_780._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar152 = ZEXT1664(auVar152._0_16_);
                          auVar210 = ZEXT1664(auVar210._0_16_);
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          (*p_Var12)(&local_690);
                        }
                        if (*local_690.valid != 0) break;
                      }
                      else {
                        auVar152 = ZEXT1664(auVar19);
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        auVar211 = ZEXT1664(auVar211._0_16_);
                        (**(code **)(local_780._0_8_ + 0x48))(&local_690);
                        if (*local_690.valid != 0) goto LAB_01646f3d;
                      }
                      local_7b0->tfar = (float)local_580._0_4_;
                      uVar95 = local_760._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                      local_760._0_8_ = uVar95;
                      lVar23 = 0;
                      for (uVar98 = uVar95; (uVar98 & 1) == 0;
                          uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                        lVar23 = lVar23 + 1;
                      }
                      local_7a0 = (undefined1  [8])lVar23;
                      local_660._0_4_ = (int)CONCAT71((int7)((ulong)lVar23 >> 8),uVar95 != 0);
                    } while (uVar95 != 0);
                  }
                  bVar94 = local_660[0] & 1;
                  auVar187 = ZEXT3264(local_6e0);
                  auVar139 = ZEXT3264(local_620);
                  auVar183 = ZEXT3264(local_640);
                  auVar179 = ZEXT3264(CONCAT428(fStack_544,
                                                CONCAT424(fStack_548,
                                                          CONCAT420(fStack_54c,
                                                                    CONCAT416(fStack_550,
                                                                              CONCAT412(fStack_554,
                                                                                        CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
                  auVar194 = ZEXT3264(CONCAT428(fStack_524,
                                                CONCAT424(fStack_528,
                                                          CONCAT420(fStack_52c,
                                                                    CONCAT416(fStack_530,
                                                                              CONCAT412(fStack_534,
                                                                                        CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
                  auVar206 = ZEXT3264(local_6c0);
                  auVar217 = ZEXT3264(local_700);
                  uVar98 = (ulong)(uint)local_720._0_4_;
                  pre = local_730;
                }
LAB_0164704e:
                uVar98 = CONCAT71((int7)(uVar98 >> 8),(byte)uVar98 | bVar94);
                auVar158 = ZEXT3264(local_600);
                goto LAB_01646bc4;
              }
            }
            auVar183 = ZEXT3264(local_640);
            auVar158 = ZEXT3264(local_600);
            auVar139 = ZEXT3264(local_620);
            auVar194 = ZEXT3264(auVar89);
            auVar187 = ZEXT3264(local_6e0);
          }
LAB_01646bc4:
          lVar99 = lVar99 + 8;
          uVar95 = uVar98;
        } while ((int)lVar99 < iVar10);
      }
      if ((uVar98 & 1) != 0) {
        return bVar102;
      }
      fVar141 = local_7b0->tfar;
      auVar109._4_4_ = fVar141;
      auVar109._0_4_ = fVar141;
      auVar109._8_4_ = fVar141;
      auVar109._12_4_ = fVar141;
      auVar19 = vcmpps_avx(local_340,auVar109,2);
      uVar96 = vmovmskps_avx(auVar19);
      uVar96 = (uint)uVar101 & uVar96;
      bVar102 = uVar96 != 0;
      context = local_7b8;
      pPVar100 = local_738;
      ray = local_7b0;
    } while (bVar102);
  }
  return bVar102;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }